

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::Swish_x86_avx2::forward_inplace(Swish_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined4 uVar12;
  undefined4 uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [24];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [24];
  undefined1 (*pauVar53) [32];
  long in_RSI;
  double dVar54;
  float fVar55;
  float fVar56;
  __m128 _p_3;
  __m256 _p_2;
  int i_2;
  float *ptr_2;
  int q_2;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  __m256 one;
  __m256 one_4;
  __m256 pow2n_2;
  __m256 y_2;
  __m256 z_2;
  __m256 mask_2;
  __m256 one_5;
  __m256i imm0_1;
  __m256 fx_2;
  __m256 tmp_2;
  __m256 pow2n;
  __m256 y;
  __m256 z;
  __m256 mask;
  __m256 one_1;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  __m128 one_2;
  __m128 one_6;
  v4sf pow2n_3;
  v4sf y_3;
  v4sf z_3;
  v4sf mask_3;
  v4sf one_7;
  v4si emm0_1;
  v4sf fx_3;
  v4sf tmp_3;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf z_1;
  v4sf mask_1;
  v4sf one_3;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  undefined8 in_stack_ffffffffffffdd28;
  Mat *this_00;
  Mat *in_stack_ffffffffffffdd30;
  int local_226c;
  Mat local_2268;
  undefined1 (*local_2220) [32];
  int local_2214;
  void *local_2210;
  int *piStack_2208;
  int local_21fc;
  Mat local_21f8;
  Mat *local_21b0;
  int local_21a4;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  int local_2168;
  Mat local_2158;
  undefined1 (*local_2110) [32];
  int local_2108;
  int local_2104;
  int local_2100;
  int local_20fc;
  int local_20f8;
  int local_20f4;
  undefined1 (*local_20d0) [32];
  undefined1 (*local_20c8) [32];
  float local_20c0;
  float fStack_20bc;
  float fStack_20b8;
  float fStack_20b4;
  float fStack_20b0;
  float fStack_20ac;
  float fStack_20a8;
  undefined4 uStack_20a4;
  undefined1 (*local_2088) [32];
  float local_2080;
  float fStack_207c;
  float fStack_2078;
  float fStack_2074;
  float fStack_2070;
  float fStack_206c;
  float fStack_2068;
  undefined4 uStack_2064;
  undefined1 (*local_2048) [32];
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined1 (*local_1ff0) [32];
  Mat *local_1fe8;
  float local_1fe0;
  float fStack_1fdc;
  float fStack_1fd8;
  float fStack_1fd4;
  undefined1 (*local_1fc8) [32];
  float local_1fc0;
  float fStack_1fbc;
  float fStack_1fb8;
  float fStack_1fb4;
  Mat *local_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  void *local_1f90;
  int *piStack_1f88;
  undefined1 local_1f80 [8];
  float fStack_1f78;
  float fStack_1f74;
  float fStack_1f70;
  float fStack_1f6c;
  float fStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined1 local_1f40 [8];
  float fStack_1f38;
  float fStack_1f34;
  float fStack_1f30;
  float fStack_1f2c;
  float fStack_1f28;
  undefined1 local_1f20 [8];
  float fStack_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  float fStack_1f08;
  undefined4 uStack_1f04;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined1 local_1ea0 [32];
  undefined4 local_1e68;
  undefined4 local_1e64;
  float local_1e60;
  float fStack_1e5c;
  float fStack_1e58;
  float fStack_1e54;
  float fStack_1e50;
  float fStack_1e4c;
  float fStack_1e48;
  float fStack_1e44;
  undefined1 local_1e40 [32];
  float local_1e20;
  float fStack_1e1c;
  float fStack_1e18;
  float fStack_1e14;
  float fStack_1e10;
  float fStack_1e0c;
  float fStack_1e08;
  float fStack_1e04;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined1 local_1dc0 [8];
  float fStack_1db8;
  float fStack_1db4;
  float fStack_1db0;
  float fStack_1dac;
  float fStack_1da8;
  float fStack_1da4;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  float local_1d40;
  float fStack_1d3c;
  float fStack_1d38;
  float fStack_1d34;
  float fStack_1d30;
  float fStack_1d2c;
  float fStack_1d28;
  float fStack_1d24;
  float local_1d20;
  float fStack_1d1c;
  float fStack_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  undefined1 local_1d00 [32];
  undefined4 local_1ce0;
  undefined4 uStack_1cdc;
  undefined4 uStack_1cd8;
  undefined4 uStack_1cd4;
  undefined4 uStack_1cd0;
  undefined4 uStack_1ccc;
  undefined4 uStack_1cc8;
  undefined4 uStack_1cc4;
  undefined1 local_1cc0 [32];
  undefined1 local_1ca0 [8];
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined1 local_1c80 [8];
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined1 local_1c60 [32];
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined1 local_1c20 [32];
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined4 local_1a40;
  undefined4 uStack_1a3c;
  undefined4 uStack_1a38;
  undefined4 uStack_1a34;
  undefined4 uStack_1a30;
  undefined4 uStack_1a2c;
  undefined4 uStack_1a28;
  undefined4 uStack_1a24;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined4 local_1a00;
  undefined4 uStack_19fc;
  undefined4 uStack_19f8;
  undefined4 uStack_19f4;
  undefined4 uStack_19f0;
  undefined4 uStack_19ec;
  undefined4 uStack_19e8;
  undefined4 uStack_19e4;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined4 local_19c0;
  undefined4 uStack_19bc;
  undefined4 uStack_19b8;
  undefined4 uStack_19b4;
  undefined4 uStack_19b0;
  undefined4 uStack_19ac;
  undefined4 uStack_19a8;
  undefined4 uStack_19a4;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined4 local_1900;
  undefined4 uStack_18fc;
  undefined4 uStack_18f8;
  undefined4 uStack_18f4;
  undefined4 uStack_18f0;
  undefined4 uStack_18ec;
  undefined4 uStack_18e8;
  undefined4 uStack_18e4;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined4 local_18c0;
  undefined4 uStack_18bc;
  undefined4 uStack_18b8;
  undefined4 uStack_18b4;
  undefined4 uStack_18b0;
  undefined4 uStack_18ac;
  undefined4 uStack_18a8;
  undefined4 uStack_18a4;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined4 local_1880;
  undefined4 uStack_187c;
  undefined4 uStack_1878;
  undefined4 uStack_1874;
  undefined4 uStack_1870;
  undefined4 uStack_186c;
  undefined4 uStack_1868;
  undefined4 uStack_1864;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined4 local_1840;
  undefined4 uStack_183c;
  undefined4 uStack_1838;
  undefined4 uStack_1834;
  undefined4 uStack_1830;
  undefined4 uStack_182c;
  undefined4 uStack_1828;
  undefined4 uStack_1824;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined4 local_1800;
  undefined4 uStack_17fc;
  undefined4 uStack_17f8;
  undefined4 uStack_17f4;
  undefined4 uStack_17f0;
  undefined4 uStack_17ec;
  undefined4 uStack_17e8;
  undefined4 uStack_17e4;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined4 local_17c0;
  undefined4 uStack_17bc;
  undefined4 uStack_17b8;
  undefined4 uStack_17b4;
  undefined4 uStack_17b0;
  undefined4 uStack_17ac;
  undefined4 uStack_17a8;
  undefined4 uStack_17a4;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  float local_1740;
  float fStack_173c;
  float fStack_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float fStack_1728;
  float fStack_1724;
  undefined1 local_1720 [32];
  undefined4 local_1700;
  undefined4 uStack_16fc;
  undefined4 uStack_16f8;
  undefined4 uStack_16f4;
  undefined4 uStack_16f0;
  undefined4 uStack_16ec;
  undefined4 uStack_16e8;
  undefined4 uStack_16e4;
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [8];
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined1 local_16a0 [8];
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined1 local_1680 [32];
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined4 local_1460;
  undefined4 uStack_145c;
  undefined4 uStack_1458;
  undefined4 uStack_1454;
  undefined4 uStack_1450;
  undefined4 uStack_144c;
  undefined4 uStack_1448;
  undefined4 uStack_1444;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined4 local_1420;
  undefined4 uStack_141c;
  undefined4 uStack_1418;
  undefined4 uStack_1414;
  undefined4 uStack_1410;
  undefined4 uStack_140c;
  undefined4 uStack_1408;
  undefined4 uStack_1404;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined4 local_13e0;
  undefined4 uStack_13dc;
  undefined4 uStack_13d8;
  undefined4 uStack_13d4;
  undefined4 uStack_13d0;
  undefined4 uStack_13cc;
  undefined4 uStack_13c8;
  undefined4 uStack_13c4;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined4 local_1320;
  undefined4 uStack_131c;
  undefined4 uStack_1318;
  undefined4 uStack_1314;
  undefined4 uStack_1310;
  undefined4 uStack_130c;
  undefined4 uStack_1308;
  undefined4 uStack_1304;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined4 local_12e0;
  undefined4 uStack_12dc;
  undefined4 uStack_12d8;
  undefined4 uStack_12d4;
  undefined4 uStack_12d0;
  undefined4 uStack_12cc;
  undefined4 uStack_12c8;
  undefined4 uStack_12c4;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined4 local_12a0;
  undefined4 uStack_129c;
  undefined4 uStack_1298;
  undefined4 uStack_1294;
  undefined4 uStack_1290;
  undefined4 uStack_128c;
  undefined4 uStack_1288;
  undefined4 uStack_1284;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined4 local_1260;
  undefined4 uStack_125c;
  undefined4 uStack_1258;
  undefined4 uStack_1254;
  undefined4 uStack_1250;
  undefined4 uStack_124c;
  undefined4 uStack_1248;
  undefined4 uStack_1244;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined4 local_1220;
  undefined4 uStack_121c;
  undefined4 uStack_1218;
  undefined4 uStack_1214;
  undefined4 uStack_1210;
  undefined4 uStack_120c;
  undefined4 uStack_1208;
  undefined4 uStack_1204;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined4 local_11e0;
  undefined4 uStack_11dc;
  undefined4 uStack_11d8;
  undefined4 uStack_11d4;
  undefined4 uStack_11d0;
  undefined4 uStack_11cc;
  undefined4 uStack_11c8;
  undefined4 uStack_11c4;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  ulong uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  ulong uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined1 local_fa0 [32];
  undefined1 local_f80 [32];
  undefined1 local_f60 [32];
  undefined1 local_f40 [32];
  undefined1 local_f20 [16];
  undefined1 auStack_f10 [16];
  undefined4 local_f00;
  undefined4 local_efc;
  undefined4 local_ef8;
  undefined4 local_ef4;
  undefined4 local_ef0;
  undefined4 local_eec;
  undefined4 local_ee8;
  undefined4 local_ee4;
  undefined1 local_ee0 [16];
  undefined1 auStack_ed0 [16];
  undefined4 local_ec0;
  undefined4 local_ebc;
  undefined4 local_eb8;
  undefined4 local_eb4;
  undefined4 local_eb0;
  undefined4 local_eac;
  undefined4 local_ea8;
  undefined4 local_ea4;
  undefined4 local_ea0;
  undefined4 uStack_e9c;
  undefined4 uStack_e98;
  undefined4 uStack_e94;
  undefined4 uStack_e90;
  undefined4 uStack_e8c;
  undefined4 uStack_e88;
  undefined4 uStack_e84;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined4 local_e60;
  undefined4 uStack_e5c;
  undefined4 uStack_e58;
  undefined4 uStack_e54;
  undefined4 uStack_e50;
  undefined4 uStack_e4c;
  undefined4 uStack_e48;
  undefined4 uStack_e44;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined4 local_e20;
  undefined4 uStack_e1c;
  undefined4 uStack_e18;
  undefined4 uStack_e14;
  undefined4 uStack_e10;
  undefined4 uStack_e0c;
  undefined4 uStack_e08;
  undefined4 uStack_e04;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined4 local_de0;
  undefined4 uStack_ddc;
  undefined4 uStack_dd8;
  undefined4 uStack_dd4;
  undefined4 uStack_dd0;
  undefined4 uStack_dcc;
  undefined4 uStack_dc8;
  undefined4 uStack_dc4;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined4 local_c44;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined4 local_c04;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined4 local_b04;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined4 local_ac4;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined1 local_a40 [16];
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined1 local_a20 [16];
  undefined4 local_a10;
  undefined4 uStack_a0c;
  undefined4 uStack_a08;
  undefined4 uStack_a04;
  undefined4 local_9f4;
  undefined4 local_9f0;
  undefined4 uStack_9ec;
  undefined4 uStack_9e8;
  undefined4 uStack_9e4;
  undefined4 local_9d4;
  float local_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [16];
  float local_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [16];
  undefined8 local_990;
  undefined8 uStack_988;
  undefined1 local_980 [16];
  undefined8 local_970;
  undefined8 uStack_968;
  undefined1 local_960 [16];
  undefined8 local_950;
  undefined8 uStack_948;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float local_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [16];
  undefined4 local_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined1 local_900 [16];
  undefined1 local_8f0 [8];
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined1 local_8d0 [16];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined1 local_8b0 [16];
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined4 local_7c0;
  undefined4 uStack_7bc;
  undefined4 uStack_7b8;
  undefined4 uStack_7b4;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined4 local_7a0;
  undefined4 uStack_79c;
  undefined4 uStack_798;
  undefined4 uStack_794;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined4 local_780;
  undefined4 uStack_77c;
  undefined4 uStack_778;
  undefined4 uStack_774;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined4 local_720;
  undefined4 uStack_71c;
  undefined4 uStack_718;
  undefined4 uStack_714;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined4 local_700;
  undefined4 uStack_6fc;
  undefined4 uStack_6f8;
  undefined4 uStack_6f4;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  undefined4 uStack_6d8;
  undefined4 uStack_6d4;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined4 local_6c0;
  undefined4 uStack_6bc;
  undefined4 uStack_6b8;
  undefined4 uStack_6b4;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined4 local_6a0;
  undefined4 uStack_69c;
  undefined4 uStack_698;
  undefined4 uStack_694;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined4 local_680;
  undefined4 uStack_67c;
  undefined4 uStack_678;
  undefined4 uStack_674;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_630 [16];
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined1 local_610 [16];
  undefined1 local_600 [8];
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [16];
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [16];
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined4 local_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined4 local_4b0;
  undefined4 uStack_4ac;
  undefined4 uStack_4a8;
  undefined4 uStack_4a4;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined4 local_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined4 local_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined4 local_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  ulong uStack_298;
  void *local_290;
  int *piStack_288;
  undefined8 local_280;
  ulong uStack_278;
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined4 local_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined4 local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined4 local_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined4 local_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined4 local_64;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined1 auVar13 [16];
  
  local_20f4 = *(int *)(in_RSI + 0x2c);
  local_20f8 = *(int *)(in_RSI + 0x30);
  local_20fc = *(int *)(in_RSI + 0x38);
  local_2100 = local_20f4 * local_20f8;
  local_2104 = *(int *)(in_RSI + 0x18);
  if (local_2104 == 8) {
    local_2104 = 8;
    for (local_2108 = 0; local_2108 < local_20fc; local_2108 = local_2108 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffffdd30,(int)((ulong)in_stack_ffffffffffffdd28 >> 0x20));
      pauVar53 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_2158);
      ncnn::Mat::~Mat((Mat *)0x903084);
      local_2110 = pauVar53;
      for (local_2168 = 0; local_2168 < local_2100; local_2168 = local_2168 + 1) {
        local_20c8 = local_2110;
        local_21a0 = *(undefined8 *)*local_2110;
        uStack_2198 = *(undefined8 *)(*local_2110 + 8);
        uStack_2190 = *(undefined8 *)(*local_2110 + 0x10);
        uStack_2188 = *(undefined8 *)(*local_2110 + 0x18);
        local_2048 = local_2110;
        local_1e64 = 0x3f800000;
        local_f00 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_f20 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_f10 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_1f00 = local_f20._0_8_;
        uStack_1ef8 = local_f20._8_8_;
        uStack_1ef0 = auStack_f10._0_8_;
        uStack_1ee8 = auStack_f10._8_8_;
        local_1e00 = local_f20._0_8_;
        uStack_1df8 = local_f20._8_8_;
        uStack_1df0 = auStack_f10._0_8_;
        uStack_1de8 = auStack_f10._8_8_;
        local_fa0 = ZEXT832(0) << 0x20;
        local_fc0 = 0;
        local_f40._8_8_ = SUB328(ZEXT832(0),4);
        uStack_fb8 = local_f40._8_8_;
        uStack_fb0 = 0;
        uStack_fa8 = 0;
        auVar6 = vsubps_avx(ZEXT832((ulong)local_f40._8_8_) << 0x40,*local_2110);
        local_1700 = 0x3f800000;
        uStack_16fc = 0x3f800000;
        uStack_16f8 = 0x3f800000;
        uStack_16f4 = 0x3f800000;
        uStack_16f0 = 0x3f800000;
        uStack_16ec = 0x3f800000;
        uStack_16e8 = 0x3f800000;
        uStack_16e4 = 0x3f800000;
        local_1680._0_8_ = auVar6._0_8_;
        local_e80 = local_1680._0_8_;
        local_1680._8_8_ = auVar6._8_8_;
        uStack_e78 = local_1680._8_8_;
        local_1680._16_8_ = auVar6._16_8_;
        uStack_e70 = local_1680._16_8_;
        local_1680._24_8_ = auVar6._24_8_;
        uStack_e68 = local_1680._24_8_;
        local_ea0 = 0x42b0c0a5;
        uStack_e9c = 0x42b0c0a5;
        uStack_e98 = 0x42b0c0a5;
        uStack_e94 = 0x42b0c0a5;
        uStack_e90 = 0x42b0c0a5;
        uStack_e8c = 0x42b0c0a5;
        uStack_e88 = 0x42b0c0a5;
        uStack_e84 = 0x42b0c0a5;
        auVar20._8_4_ = 0x42b0c0a5;
        auVar20._0_8_ = 0x42b0c0a542b0c0a5;
        auVar20._12_4_ = 0x42b0c0a5;
        auVar20._16_4_ = 0x42b0c0a5;
        auVar20._20_4_ = 0x42b0c0a5;
        auVar20._24_4_ = 0x42b0c0a5;
        auVar20._28_4_ = 0x42b0c0a5;
        auVar6 = vminps_avx(auVar6,auVar20);
        local_1680._0_8_ = auVar6._0_8_;
        local_e00 = local_1680._0_8_;
        local_1680._8_8_ = auVar6._8_8_;
        uStack_df8 = local_1680._8_8_;
        local_1680._16_8_ = auVar6._16_8_;
        uStack_df0 = local_1680._16_8_;
        local_1680._24_8_ = auVar6._24_8_;
        uStack_de8 = local_1680._24_8_;
        local_e20 = 0xc2b0c0a5;
        uStack_e1c = 0xc2b0c0a5;
        uStack_e18 = 0xc2b0c0a5;
        uStack_e14 = 0xc2b0c0a5;
        uStack_e10 = 0xc2b0c0a5;
        uStack_e0c = 0xc2b0c0a5;
        uStack_e08 = 0xc2b0c0a5;
        uStack_e04 = 0xc2b0c0a5;
        auVar22._8_4_ = 0xc2b0c0a5;
        auVar22._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar22._12_4_ = 0xc2b0c0a5;
        auVar22._16_4_ = 0xc2b0c0a5;
        auVar22._20_4_ = 0xc2b0c0a5;
        auVar22._24_4_ = 0xc2b0c0a5;
        auVar22._28_4_ = 0xc2b0c0a5;
        auVar4 = vmaxps_avx(auVar6,auVar22);
        local_1680._0_8_ = auVar4._0_8_;
        uVar7 = local_1680._0_8_;
        local_1680._8_8_ = auVar4._8_8_;
        uVar8 = local_1680._8_8_;
        local_1680._16_8_ = auVar4._16_8_;
        uVar9 = local_1680._16_8_;
        local_1680._24_8_ = auVar4._24_8_;
        uVar10 = local_1680._24_8_;
        local_13e0 = 0x3fb8aa3b;
        uStack_13dc = 0x3fb8aa3b;
        uStack_13d8 = 0x3fb8aa3b;
        uStack_13d4 = 0x3fb8aa3b;
        uStack_13d0 = 0x3fb8aa3b;
        uStack_13cc = 0x3fb8aa3b;
        uStack_13c8 = 0x3fb8aa3b;
        uStack_13c4 = 0x3fb8aa3b;
        local_13c0._0_4_ = auVar4._0_4_;
        local_13c0._4_4_ = auVar4._4_4_;
        uStack_13b8._0_4_ = auVar4._8_4_;
        uStack_13b8._4_4_ = auVar4._12_4_;
        uStack_13b0._0_4_ = auVar4._16_4_;
        uStack_13b0._4_4_ = auVar4._20_4_;
        uStack_13a8._0_4_ = auVar4._24_4_;
        uStack_13a8._4_4_ = auVar4._28_4_;
        local_16c0._4_4_ = local_13c0._4_4_ * 1.442695;
        local_16c0._0_4_ = (float)local_13c0 * 1.442695;
        uStack_16b8._0_4_ = (float)uStack_13b8 * 1.442695;
        uStack_16b8._4_4_ = uStack_13b8._4_4_ * 1.442695;
        uStack_16b0._0_4_ = (float)uStack_13b0 * 1.442695;
        uStack_16b0._4_4_ = uStack_13b0._4_4_ * 1.442695;
        auVar48 = _local_16c0;
        uStack_16a8._0_4_ = (float)uStack_13a8 * 1.442695;
        uStack_16a8._4_4_ = uStack_13a8._4_4_;
        auVar6 = _local_16c0;
        local_11c0 = local_16c0;
        uStack_11b8 = uStack_16b8;
        uStack_16b0 = auVar48._16_8_;
        uStack_11b0 = uStack_16b0;
        uStack_16a8 = auVar6._24_8_;
        uStack_11a8 = uStack_16a8;
        local_11e0 = 0x3f000000;
        uStack_11dc = 0x3f000000;
        uStack_11d8 = 0x3f000000;
        uStack_11d4 = 0x3f000000;
        uStack_11d0 = 0x3f000000;
        uStack_11cc = 0x3f000000;
        uStack_11c8 = 0x3f000000;
        uStack_11c4 = 0x3f000000;
        local_16c0._4_4_ = local_13c0._4_4_ * 1.442695 + 0.5;
        local_16c0._0_4_ = (float)local_13c0 * 1.442695 + 0.5;
        uStack_16b8._0_4_ = (float)uStack_13b8 * 1.442695 + 0.5;
        uStack_16b8._4_4_ = uStack_13b8._4_4_ * 1.442695 + 0.5;
        uStack_16b0._0_4_ = (float)uStack_13b0 * 1.442695 + 0.5;
        uStack_16b0._4_4_ = uStack_13b0._4_4_ * 1.442695 + 0.5;
        uStack_16a8._0_4_ = (float)uStack_13a8 * 1.442695 + 0.5;
        uStack_16a8._4_4_ = uStack_13a8._4_4_ + 0.5;
        auVar5 = vroundps_avx(_local_16c0,1);
        auVar6 = vcmpps_avx(_local_16c0,auVar5,1);
        local_1720._0_8_ = auVar6._0_8_;
        local_d80 = local_1720._0_8_;
        local_1720._8_8_ = auVar6._8_8_;
        uStack_d78 = local_1720._8_8_;
        local_1720._16_8_ = auVar6._16_8_;
        uStack_d70 = local_1720._16_8_;
        local_1720._24_8_ = auVar6._24_8_;
        uStack_d68 = local_1720._24_8_;
        local_da0 = 0x3f8000003f800000;
        uStack_d98 = 0x3f8000003f800000;
        uStack_d90 = 0x3f8000003f800000;
        uStack_d88 = 0x3f8000003f800000;
        auVar24._8_8_ = 0x3f8000003f800000;
        auVar24._0_8_ = 0x3f8000003f800000;
        auVar24._16_8_ = 0x3f8000003f800000;
        auVar24._24_8_ = 0x3f8000003f800000;
        local_1720 = vpand_avx2(auVar6,auVar24);
        local_16a0 = auVar5._0_8_;
        local_1100 = local_16a0;
        uStack_1698 = auVar5._8_8_;
        uStack_10f8 = uStack_1698;
        uStack_1690 = auVar5._16_8_;
        uStack_10f0 = uStack_1690;
        uStack_1688 = auVar5._24_8_;
        uStack_10e8 = uStack_1688;
        local_1120 = local_1720._0_8_;
        uStack_1118 = local_1720._8_8_;
        uStack_1110 = local_1720._16_8_;
        uStack_1108 = local_1720._24_8_;
        _local_16c0 = vsubps_avx(auVar5,local_1720);
        local_1420 = 0x3f318000;
        uStack_141c = 0x3f318000;
        uStack_1418 = 0x3f318000;
        uStack_1414 = 0x3f318000;
        uStack_1410 = 0x3f318000;
        uStack_140c = 0x3f318000;
        uStack_1408 = 0x3f318000;
        uStack_1404 = 0x3f318000;
        local_1400._0_4_ = local_16c0._0_4_;
        local_1400._4_4_ = local_16c0._4_4_;
        uStack_13f8._0_4_ = local_16c0._8_4_;
        uStack_13f8._4_4_ = local_16c0._12_4_;
        uStack_13f0._0_4_ = local_16c0._16_4_;
        uStack_13f0._4_4_ = local_16c0._20_4_;
        uStack_13e8._0_4_ = local_16c0._24_4_;
        uStack_13e8._4_4_ = local_16c0._28_4_;
        local_16a0._4_4_ = local_1400._4_4_ * 0.6933594;
        local_16a0._0_4_ = (float)local_1400 * 0.6933594;
        uStack_1698._0_4_ = (float)uStack_13f8 * 0.6933594;
        uStack_1698._4_4_ = uStack_13f8._4_4_ * 0.6933594;
        uStack_1690._0_4_ = (float)uStack_13f0 * 0.6933594;
        uStack_1690._4_4_ = uStack_13f0._4_4_ * 0.6933594;
        auVar48 = _local_16a0;
        uStack_1688._0_4_ = (float)uStack_13e8 * 0.6933594;
        uStack_1688._4_4_ = uStack_13e8._4_4_;
        auVar5 = _local_16a0;
        local_1440 = local_16c0;
        uStack_1438 = uStack_16b8;
        uStack_1430 = uStack_16b0;
        uStack_1428 = uStack_16a8;
        local_1460 = 0xb95e8083;
        uStack_145c = 0xb95e8083;
        uStack_1458 = 0xb95e8083;
        uStack_1454 = 0xb95e8083;
        uStack_1450 = 0xb95e8083;
        uStack_144c = 0xb95e8083;
        uStack_1448 = 0xb95e8083;
        uStack_1444 = 0xb95e8083;
        local_1140 = local_1680._0_8_;
        uStack_1138 = local_1680._8_8_;
        uStack_1130 = local_1680._16_8_;
        uStack_1128 = local_1680._24_8_;
        local_1160 = local_16a0;
        uStack_1158 = uStack_1698;
        uStack_1690 = auVar48._16_8_;
        uStack_1150 = uStack_1690;
        uStack_1688 = auVar5._24_8_;
        uStack_1148 = uStack_1688;
        auVar18._16_8_ = uStack_1690;
        auVar18._0_16_ = _local_16a0;
        auVar18._24_8_ = uStack_1688;
        auVar6 = vsubps_avx(auVar4,auVar18);
        local_1680._0_8_ = auVar6._0_8_;
        local_1180 = local_1680._0_8_;
        local_1680._8_8_ = auVar6._8_8_;
        uStack_1178 = local_1680._8_8_;
        local_1680._16_8_ = auVar6._16_8_;
        uStack_1170 = local_1680._16_8_;
        local_1680._24_8_ = auVar6._24_8_;
        uStack_1168 = local_1680._24_8_;
        local_11a0 = CONCAT44(local_1400._4_4_ * -0.00021219444,(float)local_1400 * -0.00021219444);
        uStack_1198 = CONCAT44(uStack_13f8._4_4_ * -0.00021219444,
                               (float)uStack_13f8 * -0.00021219444);
        uStack_1190 = CONCAT44(uStack_13f0._4_4_ * -0.00021219444,
                               (float)uStack_13f0 * -0.00021219444);
        uStack_1188 = CONCAT44(uStack_13e8._4_4_,(float)uStack_13e8 * -0.00021219444);
        auVar17._8_8_ = uStack_1198;
        auVar17._0_8_ = local_11a0;
        auVar17._16_8_ = uStack_1190;
        auVar17._24_8_ = uStack_1188;
        local_1680 = vsubps_avx(auVar6,auVar17);
        local_14a0 = local_1680._0_8_;
        uStack_1498 = local_1680._8_8_;
        uStack_1490 = local_1680._16_8_;
        uStack_1488 = local_1680._24_8_;
        local_1480._0_4_ = local_1680._0_4_;
        local_1480._4_4_ = local_1680._4_4_;
        uStack_1478._0_4_ = local_1680._8_4_;
        uStack_1478._4_4_ = local_1680._12_4_;
        uStack_1470._0_4_ = local_1680._16_4_;
        uStack_1470._4_4_ = local_1680._20_4_;
        uStack_1468._0_4_ = local_1680._24_4_;
        uStack_1468._4_4_ = local_1680._28_4_;
        fStack_1724 = uStack_1468._4_4_;
        local_1740 = (float)local_1480 * (float)local_1480;
        fStack_173c = local_1480._4_4_ * local_1480._4_4_;
        fStack_1738 = (float)uStack_1478 * (float)uStack_1478;
        fStack_1734 = uStack_1478._4_4_ * uStack_1478._4_4_;
        fStack_1730 = (float)uStack_1470 * (float)uStack_1470;
        fStack_172c = uStack_1470._4_4_ * uStack_1470._4_4_;
        fStack_1728 = (float)uStack_1468 * (float)uStack_1468;
        local_14c0 = 0x3950696739506967;
        uStack_14b8 = 0x3950696739506967;
        uStack_14b0 = 0x3950696739506967;
        uStack_14a8 = 0x3950696739506967;
        local_14e0 = local_1680._0_8_;
        uStack_14d8 = local_1680._8_8_;
        uStack_14d0 = local_1680._16_8_;
        uStack_14c8 = local_1680._24_8_;
        local_1200 = CONCAT44(local_1480._4_4_ * 0.00019875691,(float)local_1480 * 0.00019875691);
        uStack_11f8 = CONCAT44(uStack_1478._4_4_ * 0.00019875691,(float)uStack_1478 * 0.00019875691)
        ;
        uStack_11f0 = CONCAT44(uStack_1470._4_4_ * 0.00019875691,(float)uStack_1470 * 0.00019875691)
        ;
        uStack_11e8 = CONCAT44(0x39506967,(float)uStack_1468 * 0.00019875691);
        local_1220 = 0x3ab743ce;
        uStack_121c = 0x3ab743ce;
        uStack_1218 = 0x3ab743ce;
        uStack_1214 = 0x3ab743ce;
        uStack_1210 = 0x3ab743ce;
        uStack_120c = 0x3ab743ce;
        uStack_1208 = 0x3ab743ce;
        uStack_1204 = 0x3ab743ce;
        local_1760 = (float)local_1480 * 0.00019875691 + 0.0013981999;
        fStack_175c = local_1480._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1758 = (float)uStack_1478 * 0.00019875691 + 0.0013981999;
        fStack_1754 = uStack_1478._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1750 = (float)uStack_1470 * 0.00019875691 + 0.0013981999;
        fStack_174c = uStack_1470._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1748 = (float)uStack_1468 * 0.00019875691 + 0.0013981999;
        local_1500 = CONCAT44(fStack_175c,local_1760);
        uStack_14f8 = CONCAT44(fStack_1754,fStack_1758);
        uStack_14f0 = CONCAT44(fStack_174c,fStack_1750);
        uStack_14e8 = CONCAT44(0x3ad150fb,fStack_1748);
        local_1520 = local_1680._0_8_;
        uStack_1518 = local_1680._8_8_;
        uStack_1510 = local_1680._16_8_;
        uStack_1508 = local_1680._24_8_;
        local_1760 = local_1760 * (float)local_1480;
        fStack_175c = fStack_175c * local_1480._4_4_;
        fStack_1758 = fStack_1758 * (float)uStack_1478;
        fStack_1754 = fStack_1754 * uStack_1478._4_4_;
        fStack_1750 = fStack_1750 * (float)uStack_1470;
        fStack_174c = fStack_174c * uStack_1470._4_4_;
        fStack_1748 = fStack_1748 * (float)uStack_1468;
        local_1240 = CONCAT44(fStack_175c,local_1760);
        uStack_1238 = CONCAT44(fStack_1754,fStack_1758);
        uStack_1230 = CONCAT44(fStack_174c,fStack_1750);
        uStack_1228 = CONCAT44(0x3ad150fb,fStack_1748);
        local_1260 = 0x3c088908;
        uStack_125c = 0x3c088908;
        uStack_1258 = 0x3c088908;
        uStack_1254 = 0x3c088908;
        uStack_1250 = 0x3c088908;
        uStack_124c = 0x3c088908;
        uStack_1248 = 0x3c088908;
        uStack_1244 = 0x3c088908;
        local_1760 = local_1760 + 0.008333452;
        fStack_175c = fStack_175c + 0.008333452;
        fStack_1758 = fStack_1758 + 0.008333452;
        fStack_1754 = fStack_1754 + 0.008333452;
        fStack_1750 = fStack_1750 + 0.008333452;
        fStack_174c = fStack_174c + 0.008333452;
        fStack_1748 = fStack_1748 + 0.008333452;
        local_1540 = CONCAT44(fStack_175c,local_1760);
        uStack_1538 = CONCAT44(fStack_1754,fStack_1758);
        uStack_1530 = CONCAT44(fStack_174c,fStack_1750);
        uStack_1528 = CONCAT44(0x3c22b327,fStack_1748);
        local_1560 = local_1680._0_8_;
        uStack_1558 = local_1680._8_8_;
        uStack_1550 = local_1680._16_8_;
        uStack_1548 = local_1680._24_8_;
        local_1760 = local_1760 * (float)local_1480;
        fStack_175c = fStack_175c * local_1480._4_4_;
        fStack_1758 = fStack_1758 * (float)uStack_1478;
        fStack_1754 = fStack_1754 * uStack_1478._4_4_;
        fStack_1750 = fStack_1750 * (float)uStack_1470;
        fStack_174c = fStack_174c * uStack_1470._4_4_;
        fStack_1748 = fStack_1748 * (float)uStack_1468;
        local_1280 = CONCAT44(fStack_175c,local_1760);
        uStack_1278 = CONCAT44(fStack_1754,fStack_1758);
        uStack_1270 = CONCAT44(fStack_174c,fStack_1750);
        uStack_1268 = CONCAT44(0x3c22b327,fStack_1748);
        local_12a0 = 0x3d2aa9c1;
        uStack_129c = 0x3d2aa9c1;
        uStack_1298 = 0x3d2aa9c1;
        uStack_1294 = 0x3d2aa9c1;
        uStack_1290 = 0x3d2aa9c1;
        uStack_128c = 0x3d2aa9c1;
        uStack_1288 = 0x3d2aa9c1;
        uStack_1284 = 0x3d2aa9c1;
        local_1760 = local_1760 + 0.041665796;
        fStack_175c = fStack_175c + 0.041665796;
        fStack_1758 = fStack_1758 + 0.041665796;
        fStack_1754 = fStack_1754 + 0.041665796;
        fStack_1750 = fStack_1750 + 0.041665796;
        fStack_174c = fStack_174c + 0.041665796;
        fStack_1748 = fStack_1748 + 0.041665796;
        local_1580 = CONCAT44(fStack_175c,local_1760);
        uStack_1578 = CONCAT44(fStack_1754,fStack_1758);
        uStack_1570 = CONCAT44(fStack_174c,fStack_1750);
        uStack_1568 = CONCAT44(0x3d53568b,fStack_1748);
        local_15a0 = local_1680._0_8_;
        uStack_1598 = local_1680._8_8_;
        uStack_1590 = local_1680._16_8_;
        uStack_1588 = local_1680._24_8_;
        local_1760 = local_1760 * (float)local_1480;
        fStack_175c = fStack_175c * local_1480._4_4_;
        fStack_1758 = fStack_1758 * (float)uStack_1478;
        fStack_1754 = fStack_1754 * uStack_1478._4_4_;
        fStack_1750 = fStack_1750 * (float)uStack_1470;
        fStack_174c = fStack_174c * uStack_1470._4_4_;
        fStack_1748 = fStack_1748 * (float)uStack_1468;
        local_12c0 = CONCAT44(fStack_175c,local_1760);
        uStack_12b8 = CONCAT44(fStack_1754,fStack_1758);
        uStack_12b0 = CONCAT44(fStack_174c,fStack_1750);
        uStack_12a8 = CONCAT44(0x3d53568b,fStack_1748);
        local_12e0 = 0x3e2aaaaa;
        uStack_12dc = 0x3e2aaaaa;
        uStack_12d8 = 0x3e2aaaaa;
        uStack_12d4 = 0x3e2aaaaa;
        uStack_12d0 = 0x3e2aaaaa;
        uStack_12cc = 0x3e2aaaaa;
        uStack_12c8 = 0x3e2aaaaa;
        uStack_12c4 = 0x3e2aaaaa;
        local_1760 = local_1760 + 0.16666666;
        fStack_175c = fStack_175c + 0.16666666;
        fStack_1758 = fStack_1758 + 0.16666666;
        fStack_1754 = fStack_1754 + 0.16666666;
        fStack_1750 = fStack_1750 + 0.16666666;
        fStack_174c = fStack_174c + 0.16666666;
        fStack_1748 = fStack_1748 + 0.16666666;
        local_15c0 = CONCAT44(fStack_175c,local_1760);
        uStack_15b8 = CONCAT44(fStack_1754,fStack_1758);
        uStack_15b0 = CONCAT44(fStack_174c,fStack_1750);
        uStack_15a8 = CONCAT44(0x3e5f804d,fStack_1748);
        local_15e0 = local_1680._0_8_;
        uStack_15d8 = local_1680._8_8_;
        uStack_15d0 = local_1680._16_8_;
        uStack_15c8 = local_1680._24_8_;
        local_1760 = local_1760 * (float)local_1480;
        fStack_175c = fStack_175c * local_1480._4_4_;
        fStack_1758 = fStack_1758 * (float)uStack_1478;
        fStack_1754 = fStack_1754 * uStack_1478._4_4_;
        fStack_1750 = fStack_1750 * (float)uStack_1470;
        fStack_174c = fStack_174c * uStack_1470._4_4_;
        fStack_1748 = fStack_1748 * (float)uStack_1468;
        local_1300 = CONCAT44(fStack_175c,local_1760);
        uStack_12f8 = CONCAT44(fStack_1754,fStack_1758);
        uStack_12f0 = CONCAT44(fStack_174c,fStack_1750);
        uStack_12e8 = CONCAT44(0x3e5f804d,fStack_1748);
        local_1320 = 0x3f000000;
        uStack_131c = 0x3f000000;
        uStack_1318 = 0x3f000000;
        uStack_1314 = 0x3f000000;
        uStack_1310 = 0x3f000000;
        uStack_130c = 0x3f000000;
        uStack_1308 = 0x3f000000;
        uStack_1304 = 0x3f000000;
        local_1760 = local_1760 + 0.5;
        fStack_175c = fStack_175c + 0.5;
        fStack_1758 = fStack_1758 + 0.5;
        fStack_1754 = fStack_1754 + 0.5;
        fStack_1750 = fStack_1750 + 0.5;
        fStack_174c = fStack_174c + 0.5;
        fStack_1748 = fStack_1748 + 0.5;
        local_1600 = CONCAT44(fStack_175c,local_1760);
        uStack_15f8 = CONCAT44(fStack_1754,fStack_1758);
        uStack_15f0 = CONCAT44(fStack_174c,fStack_1750);
        uStack_15e8 = CONCAT44(0x3f37e013,fStack_1748);
        local_1620 = CONCAT44(fStack_173c,local_1740);
        uStack_1618 = CONCAT44(fStack_1734,fStack_1738);
        uStack_1610 = CONCAT44(fStack_172c,fStack_1730);
        uStack_1608 = CONCAT44(uStack_1468._4_4_,fStack_1728);
        local_1760 = local_1760 * local_1740;
        fStack_175c = fStack_175c * fStack_173c;
        fStack_1758 = fStack_1758 * fStack_1738;
        fStack_1754 = fStack_1754 * fStack_1734;
        fStack_1750 = fStack_1750 * fStack_1730;
        fStack_174c = fStack_174c * fStack_172c;
        fStack_1748 = fStack_1748 * fStack_1728;
        local_1340 = CONCAT44(fStack_175c,local_1760);
        uStack_1338 = CONCAT44(fStack_1754,fStack_1758);
        uStack_1330 = CONCAT44(fStack_174c,fStack_1750);
        uStack_1328 = CONCAT44(0x3f37e013,fStack_1748);
        local_1360 = local_1680._0_8_;
        uStack_1358 = local_1680._8_8_;
        uStack_1350 = local_1680._16_8_;
        uStack_1348 = local_1680._24_8_;
        local_1760 = local_1760 + (float)local_1480;
        fStack_175c = fStack_175c + local_1480._4_4_;
        fStack_1758 = fStack_1758 + (float)uStack_1478;
        fStack_1754 = fStack_1754 + uStack_1478._4_4_;
        fStack_1750 = fStack_1750 + (float)uStack_1470;
        fStack_174c = fStack_174c + uStack_1470._4_4_;
        fStack_1748 = fStack_1748 + (float)uStack_1468;
        local_1380 = CONCAT44(fStack_175c,local_1760);
        uStack_1378 = CONCAT44(fStack_1754,fStack_1758);
        uStack_1370 = CONCAT44(fStack_174c,fStack_1750);
        uStack_1368 = CONCAT44(uStack_1468._4_4_ + 0.71826285,fStack_1748);
        local_13a0 = 0x3f8000003f800000;
        uStack_1398 = 0x3f8000003f800000;
        uStack_1390 = 0x3f8000003f800000;
        uStack_1388 = 0x3f8000003f800000;
        local_1760 = local_1760 + 1.0;
        fStack_175c = fStack_175c + 1.0;
        fStack_1758 = fStack_1758 + 1.0;
        fStack_1754 = fStack_1754 + 1.0;
        fStack_1750 = fStack_1750 + 1.0;
        fStack_174c = fStack_174c + 1.0;
        fStack_1748 = fStack_1748 + 1.0;
        fStack_1744 = uStack_1468._4_4_ + 0.71826285 + 1.0;
        local_d20 = local_16c0;
        uStack_d18 = uStack_16b8;
        uStack_d10 = uStack_16b0;
        uStack_d08 = uStack_16a8;
        local_16e0._4_4_ = (int)local_1400._4_4_;
        local_16e0._0_4_ = (int)(float)local_1400;
        local_16e0._8_4_ = (int)(float)uStack_13f8;
        local_16e0._12_4_ = (int)uStack_13f8._4_4_;
        local_16e0._16_4_ = (int)(float)uStack_13f0;
        local_16e0._20_4_ = (int)uStack_13f0._4_4_;
        auVar48 = local_16e0._0_24_;
        local_16e0._24_4_ = (int)(float)uStack_13e8;
        local_16e0._28_4_ = (int)uStack_13e8._4_4_;
        auVar6 = local_16e0;
        local_cc0 = local_16e0._0_8_;
        uStack_cb8 = local_16e0._8_8_;
        local_16e0._16_8_ = auVar48._16_8_;
        uStack_cb0 = local_16e0._16_8_;
        local_16e0._24_8_ = auVar6._24_8_;
        uStack_ca8 = local_16e0._24_8_;
        local_ce0 = 0x7f0000007f;
        uStack_cd8 = 0x7f0000007f;
        uStack_cd0 = 0x7f0000007f;
        uStack_cc8 = 0x7f0000007f;
        local_b40 = local_16e0._0_8_;
        uStack_b38 = local_16e0._8_8_;
        uStack_b30 = local_16e0._16_8_;
        uStack_b28 = local_16e0._24_8_;
        local_b60 = 0x7f0000007f;
        uStack_b58 = 0x7f0000007f;
        uStack_b50 = 0x7f0000007f;
        uStack_b48 = 0x7f0000007f;
        auVar29._16_8_ = local_16e0._16_8_;
        auVar29._0_16_ = local_16e0._0_16_;
        auVar29._24_8_ = local_16e0._24_8_;
        auVar28._8_8_ = 0x7f0000007f;
        auVar28._0_8_ = 0x7f0000007f;
        auVar28._16_8_ = 0x7f0000007f;
        auVar28._24_8_ = 0x7f0000007f;
        auVar6 = vpaddd_avx2(auVar29,auVar28);
        local_16e0._0_8_ = auVar6._0_8_;
        local_c40 = local_16e0._0_8_;
        local_16e0._8_8_ = auVar6._8_8_;
        uStack_c38 = local_16e0._8_8_;
        local_16e0._16_8_ = auVar6._16_8_;
        uStack_c30 = local_16e0._16_8_;
        local_16e0._24_8_ = auVar6._24_8_;
        uStack_c28 = local_16e0._24_8_;
        local_c44 = 0x17;
        local_ac0 = local_16e0._0_8_;
        uStack_ab8 = local_16e0._8_8_;
        uStack_ab0 = local_16e0._16_8_;
        uStack_aa8 = local_16e0._24_8_;
        local_ac4 = 0x17;
        local_16e0 = vpslld_avx2(auVar6,ZEXT416(0x17));
        local_be0 = local_16e0._0_8_;
        uStack_bd8 = local_16e0._8_8_;
        uStack_bd0 = local_16e0._16_8_;
        uStack_bc8 = local_16e0._24_8_;
        local_1780 = local_16e0._0_8_;
        uStack_1778 = local_16e0._8_8_;
        uStack_1770 = local_16e0._16_8_;
        uStack_1768 = local_16e0._24_8_;
        local_1640 = CONCAT44(fStack_175c,local_1760);
        uStack_1638 = CONCAT44(fStack_1754,fStack_1758);
        uStack_1630 = CONCAT44(fStack_174c,fStack_1750);
        uStack_1628 = CONCAT44(fStack_1744,fStack_1748);
        local_1660._0_4_ = local_16e0._0_4_;
        local_1660._4_4_ = local_16e0._4_4_;
        uStack_1658._0_4_ = local_16e0._8_4_;
        uStack_1658._4_4_ = local_16e0._12_4_;
        uStack_1650._0_4_ = local_16e0._16_4_;
        uStack_1650._4_4_ = local_16e0._20_4_;
        uStack_1648._0_4_ = local_16e0._24_4_;
        local_1760 = local_1760 * (float)local_1660;
        fStack_175c = fStack_175c * local_1660._4_4_;
        fStack_1758 = fStack_1758 * (float)uStack_1658;
        fStack_1754 = fStack_1754 * uStack_1658._4_4_;
        fStack_1750 = fStack_1750 * (float)uStack_1650;
        fStack_174c = fStack_174c * uStack_1650._4_4_;
        fStack_1748 = fStack_1748 * (float)uStack_1648;
        local_1da0 = CONCAT44(fStack_175c,local_1760);
        uStack_1d98 = CONCAT44(fStack_1754,fStack_1758);
        uStack_1d90 = CONCAT44(fStack_174c,fStack_1750);
        uStack_1d88 = CONCAT44(fStack_1744,fStack_1748);
        local_1d80._0_4_ = local_f20._0_4_;
        local_1d80._4_4_ = local_f20._4_4_;
        uStack_1d78._0_4_ = local_f20._8_4_;
        uStack_1d78._4_4_ = local_f20._12_4_;
        uStack_1d70._0_4_ = auStack_f10._0_4_;
        uStack_1d70._4_4_ = auStack_f10._4_4_;
        uStack_1d68._0_4_ = auStack_f10._8_4_;
        uStack_1d68._4_4_ = auStack_f10._12_4_;
        local_1e20 = (float)local_1d80 + local_1760;
        fStack_1e1c = local_1d80._4_4_ + fStack_175c;
        fStack_1e18 = (float)uStack_1d78 + fStack_1758;
        fStack_1e14 = uStack_1d78._4_4_ + fStack_1754;
        fStack_1e10 = (float)uStack_1d70 + fStack_1750;
        fStack_1e0c = uStack_1d70._4_4_ + fStack_174c;
        fStack_1e08 = (float)uStack_1d68 + fStack_1748;
        fStack_1e04 = uStack_1d68._4_4_ + fStack_1744;
        auVar16._16_8_ = auStack_f10._0_8_;
        auVar16._0_16_ = local_f20;
        auVar16._24_8_ = auStack_f10._8_8_;
        auVar15._4_4_ = fStack_1e1c;
        auVar15._0_4_ = local_1e20;
        auVar15._8_4_ = fStack_1e18;
        auVar15._12_4_ = fStack_1e14;
        auVar15._16_4_ = fStack_1e10;
        auVar15._20_4_ = fStack_1e0c;
        auVar15._24_4_ = fStack_1e08;
        auVar15._28_4_ = fStack_1e04;
        _local_1f80 = vdivps_avx(auVar16,auVar15);
        local_1f60._0_4_ = (float)local_21a0;
        local_1f60._4_4_ = (float)((ulong)local_21a0 >> 0x20);
        uStack_1f58._0_4_ = (float)uStack_2198;
        uStack_1f58._4_4_ = (float)((ulong)uStack_2198 >> 0x20);
        uStack_1f50._0_4_ = (float)uStack_2190;
        uStack_1f50._4_4_ = (float)((ulong)uStack_2190 >> 0x20);
        uStack_1f48._0_4_ = (float)uStack_2188;
        uStack_1f48._4_4_ = (undefined4)((ulong)uStack_2188 >> 0x20);
        uStack_2064 = uStack_1f48._4_4_;
        local_2080 = (float)local_1f60 * (float)local_1f80._0_4_;
        fStack_207c = local_1f60._4_4_ * (float)local_1f80._4_4_;
        fStack_2078 = (float)uStack_1f58 * fStack_1f78;
        fStack_2074 = uStack_1f58._4_4_ * fStack_1f74;
        fStack_2070 = (float)uStack_1f50 * fStack_1f70;
        fStack_206c = uStack_1f50._4_4_ * fStack_1f6c;
        fStack_2068 = (float)uStack_1f48 * fStack_1f68;
        auVar11._4_4_ = fStack_207c;
        auVar11._0_4_ = local_2080;
        auVar11._8_4_ = fStack_2078;
        auVar11._12_4_ = fStack_2074;
        auVar11._16_4_ = fStack_2070;
        auVar11._20_4_ = fStack_206c;
        auVar11._24_4_ = fStack_2068;
        auVar11._28_4_ = uStack_1f48._4_4_;
        *local_2110 = auVar11;
        local_2110 = local_2110 + 1;
        local_2020 = local_21a0;
        uStack_2018 = uStack_2198;
        uStack_2010 = uStack_2190;
        uStack_2008 = uStack_2188;
        local_1f60 = local_21a0;
        uStack_1f58 = uStack_2198;
        uStack_1f50 = uStack_2190;
        uStack_1f48 = uStack_2188;
        local_1ee0 = local_21a0;
        uStack_1ed8 = uStack_2198;
        uStack_1ed0 = uStack_2190;
        uStack_1ec8 = uStack_2188;
        local_1d80 = local_1e00;
        uStack_1d78 = uStack_1df8;
        uStack_1d70 = uStack_1df0;
        uStack_1d68 = uStack_1de8;
        _local_16a0 = auVar5;
        local_1660 = local_16e0._0_8_;
        uStack_1658 = local_16e0._8_8_;
        uStack_1650 = local_16e0._16_8_;
        uStack_1648 = local_16e0._24_8_;
        local_1480 = local_14a0;
        uStack_1478 = uStack_1498;
        uStack_1470 = uStack_1490;
        uStack_1468 = uStack_1488;
        local_1400 = local_16c0;
        uStack_13f8 = uStack_16b8;
        uStack_13f0 = uStack_16b0;
        uStack_13e8 = uStack_16a8;
        local_13c0 = uVar7;
        uStack_13b8 = uVar8;
        uStack_13b0 = uVar9;
        uStack_13a8 = uVar10;
        local_fe0 = local_21a0;
        uStack_fd8 = uStack_2198;
        uStack_fd0 = uStack_2190;
        uStack_fc8 = uStack_2188;
        local_f40 = local_fa0;
        local_efc = local_f00;
        local_ef8 = local_f00;
        local_ef4 = local_f00;
        local_ef0 = local_f00;
        local_eec = local_f00;
        local_ee8 = local_f00;
        local_ee4 = local_f00;
      }
    }
  }
  else if (local_2104 == 4) {
    local_2104 = 4;
    for (local_21a4 = 0; local_21a4 < local_20fc; local_21a4 = local_21a4 + 1) {
      this_00 = &local_21f8;
      ncnn::Mat::channel(in_stack_ffffffffffffdd30,(int)((ulong)this_00 >> 0x20));
      in_stack_ffffffffffffdd30 = (Mat *)ncnn::Mat::operator_cast_to_float_(this_00);
      ncnn::Mat::~Mat((Mat *)0x903bc8);
      local_21b0 = in_stack_ffffffffffffdd30;
      for (local_21fc = 0; local_21fc < local_2100; local_21fc = local_21fc + 1) {
        local_1fe8 = local_21b0;
        local_2210 = local_21b0->data;
        piStack_2208 = local_21b0->refcount;
        auVar49._0_8_ = local_21b0->data;
        auVar49._8_8_ = local_21b0->refcount;
        local_a40._0_8_ = local_21b0->data;
        local_a40._8_8_ = local_21b0->refcount;
        local_1fa8 = local_21b0;
        local_9d4 = 0x3f800000;
        local_9f0 = 0x3f800000;
        local_a50 = 0x3f8000003f800000;
        uStack_a48 = 0x3f8000003f800000;
        local_9a0._8_8_ = 0x3f8000003f800000;
        local_9a0._0_8_ = 0x3f8000003f800000;
        local_270 = ZEXT816(0) << 0x20;
        local_280 = 0;
        local_240._8_8_ = SUB168(ZEXT816(0),4);
        uStack_278 = local_240._8_8_;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = local_240._8_8_;
        auVar2 = vsubps_avx(auVar50 << 0x40,auVar49);
        local_620 = 0x3f800000;
        uStack_61c = 0x3f800000;
        uStack_618 = 0x3f800000;
        uStack_614 = 0x3f800000;
        local_5e0._0_8_ = auVar2._0_8_;
        local_220 = local_5e0._0_8_;
        local_5e0._8_8_ = auVar2._8_8_;
        uStack_218 = local_5e0._8_8_;
        local_230 = 0x42b0c0a5;
        uStack_22c = 0x42b0c0a5;
        uStack_228 = 0x42b0c0a5;
        uStack_224 = 0x42b0c0a5;
        auVar34._8_4_ = 0x42b0c0a5;
        auVar34._0_8_ = 0x42b0c0a542b0c0a5;
        auVar34._12_4_ = 0x42b0c0a5;
        auVar2 = vminps_avx(auVar2,auVar34);
        local_5e0._0_8_ = auVar2._0_8_;
        local_1e0 = local_5e0._0_8_;
        local_5e0._8_8_ = auVar2._8_8_;
        uStack_1d8 = local_5e0._8_8_;
        local_1f0 = 0xc2b0c0a5;
        uStack_1ec = 0xc2b0c0a5;
        uStack_1e8 = 0xc2b0c0a5;
        uStack_1e4 = 0xc2b0c0a5;
        auVar36._8_4_ = 0xc2b0c0a5;
        auVar36._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar36._12_4_ = 0xc2b0c0a5;
        auVar3 = vmaxps_avx(auVar2,auVar36);
        local_5e0._0_8_ = auVar3._0_8_;
        uVar7 = local_5e0._0_8_;
        local_5e0._8_8_ = auVar3._8_8_;
        uVar8 = local_5e0._8_8_;
        local_490 = 0x3fb8aa3b;
        uStack_48c = 0x3fb8aa3b;
        uStack_488 = 0x3fb8aa3b;
        uStack_484 = 0x3fb8aa3b;
        local_480._0_4_ = auVar3._0_4_;
        local_480._4_4_ = auVar3._4_4_;
        uStack_478._0_4_ = auVar3._8_4_;
        uStack_478._4_4_ = auVar3._12_4_;
        local_600._4_4_ = local_480._4_4_ * 1.442695;
        local_600._0_4_ = (float)local_480 * 1.442695;
        uStack_5f8._0_4_ = (float)uStack_478 * 1.442695;
        uStack_5f8._4_4_ = uStack_478._4_4_ * 1.442695;
        local_380 = local_600;
        uStack_378 = uStack_5f8;
        local_390 = 0x3f000000;
        uStack_38c = 0x3f000000;
        uStack_388 = 0x3f000000;
        uStack_384 = 0x3f000000;
        local_600._0_4_ = (float)local_480 * 1.442695 + 0.5;
        local_600._4_4_ = local_480._4_4_ * 1.442695 + 0.5;
        fVar55 = (float)uStack_478 * 1.442695 + 0.5;
        fVar56 = uStack_478._4_4_ * 1.442695 + 0.5;
        uStack_5f8._0_4_ = fVar55;
        uStack_5f8._4_4_ = fVar56;
        local_1a0 = local_600;
        uStack_198 = uStack_5f8;
        local_610._4_4_ = (int)(float)local_600._4_4_;
        local_610._0_4_ = (int)(float)local_600._0_4_;
        local_610._8_4_ = (int)fVar55;
        local_610._12_4_ = (int)fVar56;
        local_170 = local_610._0_8_;
        uStack_168 = local_610._8_8_;
        auVar38._8_8_ = local_610._8_8_;
        auVar38._0_8_ = local_610._0_8_;
        auVar1 = vcvtdq2ps_avx(auVar38);
        local_5f0 = auVar1._0_8_;
        local_140 = local_5f0;
        uStack_5e8 = auVar1._8_8_;
        uStack_138 = uStack_5e8;
        local_150 = local_600;
        uStack_148 = uStack_5f8;
        auVar40._8_8_ = uStack_5f8;
        auVar40._0_8_ = local_600;
        auVar2 = vcmpps_avx(auVar40,auVar1,1);
        local_630._0_8_ = auVar2._0_8_;
        local_100 = local_630._0_8_;
        local_630._8_8_ = auVar2._8_8_;
        uStack_f8 = local_630._8_8_;
        local_110 = 0x3f8000003f800000;
        uStack_108 = 0x3f8000003f800000;
        auVar42._8_8_ = 0x3f8000003f800000;
        auVar42._0_8_ = 0x3f8000003f800000;
        local_630 = vpand_avx(auVar2,auVar42);
        local_320 = local_5f0;
        uStack_318 = uStack_5e8;
        local_330 = local_630._0_8_;
        uStack_328 = local_630._8_8_;
        _local_600 = vsubps_avx(auVar1,local_630);
        local_4b0 = 0x3f318000;
        uStack_4ac = 0x3f318000;
        uStack_4a8 = 0x3f318000;
        uStack_4a4 = 0x3f318000;
        local_4a0._0_4_ = local_600._0_4_;
        local_4a0._4_4_ = local_600._4_4_;
        uStack_498._0_4_ = local_600._8_4_;
        uStack_498._4_4_ = local_600._12_4_;
        local_5f0 = CONCAT44(local_4a0._4_4_ * 0.6933594,(float)local_4a0 * 0.6933594);
        uStack_5e8._0_4_ = (float)uStack_498 * 0.6933594;
        uStack_5e8._4_4_ = uStack_498._4_4_ * 0.6933594;
        local_4c0 = local_600;
        uStack_4b8 = uStack_5f8;
        local_4d0 = 0xb95e8083;
        uStack_4cc = 0xb95e8083;
        uStack_4c8 = 0xb95e8083;
        uStack_4c4 = 0xb95e8083;
        local_340 = local_5e0._0_8_;
        uStack_338 = local_5e0._8_8_;
        local_350 = local_5f0;
        uStack_348 = uStack_5e8;
        auVar32._8_8_ = uStack_5e8;
        auVar32._0_8_ = local_5f0;
        auVar2 = vsubps_avx(auVar3,auVar32);
        local_5e0._0_8_ = auVar2._0_8_;
        local_360 = local_5e0._0_8_;
        local_5e0._8_8_ = auVar2._8_8_;
        uStack_358 = local_5e0._8_8_;
        local_370 = CONCAT44(local_4a0._4_4_ * -0.00021219444,(float)local_4a0 * -0.00021219444);
        uStack_368 = CONCAT44(uStack_498._4_4_ * -0.00021219444,(float)uStack_498 * -0.00021219444);
        auVar31._8_8_ = uStack_368;
        auVar31._0_8_ = local_370;
        local_5e0 = vsubps_avx(auVar2,auVar31);
        local_4f0 = local_5e0._0_8_;
        uStack_4e8 = local_5e0._8_8_;
        local_4e0._0_4_ = local_5e0._0_4_;
        local_4e0._4_4_ = local_5e0._4_4_;
        uStack_4d8._0_4_ = local_5e0._8_4_;
        uStack_4d8._4_4_ = local_5e0._12_4_;
        local_640 = (float)local_4e0 * (float)local_4e0;
        fStack_63c = local_4e0._4_4_ * local_4e0._4_4_;
        fStack_638 = (float)uStack_4d8 * (float)uStack_4d8;
        fStack_634 = uStack_4d8._4_4_ * uStack_4d8._4_4_;
        local_500 = 0x3950696739506967;
        uStack_4f8 = 0x3950696739506967;
        local_510 = local_5e0._0_8_;
        uStack_508 = local_5e0._8_8_;
        local_3a0 = CONCAT44(local_4e0._4_4_ * 0.00019875691,(float)local_4e0 * 0.00019875691);
        uStack_398 = CONCAT44(uStack_4d8._4_4_ * 0.00019875691,(float)uStack_4d8 * 0.00019875691);
        local_3b0 = 0x3ab743ce;
        uStack_3ac = 0x3ab743ce;
        uStack_3a8 = 0x3ab743ce;
        uStack_3a4 = 0x3ab743ce;
        local_650 = (float)local_4e0 * 0.00019875691 + 0.0013981999;
        fStack_64c = local_4e0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_648 = (float)uStack_4d8 * 0.00019875691 + 0.0013981999;
        fStack_644 = uStack_4d8._4_4_ * 0.00019875691 + 0.0013981999;
        local_520 = CONCAT44(fStack_64c,local_650);
        uStack_518 = CONCAT44(fStack_644,fStack_648);
        local_530 = local_5e0._0_8_;
        uStack_528 = local_5e0._8_8_;
        local_650 = local_650 * (float)local_4e0;
        fStack_64c = fStack_64c * local_4e0._4_4_;
        fStack_648 = fStack_648 * (float)uStack_4d8;
        fStack_644 = fStack_644 * uStack_4d8._4_4_;
        local_3c0 = CONCAT44(fStack_64c,local_650);
        uStack_3b8 = CONCAT44(fStack_644,fStack_648);
        local_3d0 = 0x3c088908;
        uStack_3cc = 0x3c088908;
        uStack_3c8 = 0x3c088908;
        uStack_3c4 = 0x3c088908;
        local_650 = local_650 + 0.008333452;
        fStack_64c = fStack_64c + 0.008333452;
        fStack_648 = fStack_648 + 0.008333452;
        fStack_644 = fStack_644 + 0.008333452;
        local_540 = CONCAT44(fStack_64c,local_650);
        uStack_538 = CONCAT44(fStack_644,fStack_648);
        local_550 = local_5e0._0_8_;
        uStack_548 = local_5e0._8_8_;
        local_650 = local_650 * (float)local_4e0;
        fStack_64c = fStack_64c * local_4e0._4_4_;
        fStack_648 = fStack_648 * (float)uStack_4d8;
        fStack_644 = fStack_644 * uStack_4d8._4_4_;
        local_3e0 = CONCAT44(fStack_64c,local_650);
        uStack_3d8 = CONCAT44(fStack_644,fStack_648);
        local_3f0 = 0x3d2aa9c1;
        uStack_3ec = 0x3d2aa9c1;
        uStack_3e8 = 0x3d2aa9c1;
        uStack_3e4 = 0x3d2aa9c1;
        local_650 = local_650 + 0.041665796;
        fStack_64c = fStack_64c + 0.041665796;
        fStack_648 = fStack_648 + 0.041665796;
        fStack_644 = fStack_644 + 0.041665796;
        local_560 = CONCAT44(fStack_64c,local_650);
        uStack_558 = CONCAT44(fStack_644,fStack_648);
        local_570 = local_5e0._0_8_;
        uStack_568 = local_5e0._8_8_;
        local_650 = local_650 * (float)local_4e0;
        fStack_64c = fStack_64c * local_4e0._4_4_;
        fStack_648 = fStack_648 * (float)uStack_4d8;
        fStack_644 = fStack_644 * uStack_4d8._4_4_;
        local_400 = CONCAT44(fStack_64c,local_650);
        uStack_3f8 = CONCAT44(fStack_644,fStack_648);
        local_410 = 0x3e2aaaaa;
        uStack_40c = 0x3e2aaaaa;
        uStack_408 = 0x3e2aaaaa;
        uStack_404 = 0x3e2aaaaa;
        local_650 = local_650 + 0.16666666;
        fStack_64c = fStack_64c + 0.16666666;
        fStack_648 = fStack_648 + 0.16666666;
        fStack_644 = fStack_644 + 0.16666666;
        local_580 = CONCAT44(fStack_64c,local_650);
        uStack_578 = CONCAT44(fStack_644,fStack_648);
        local_590 = local_5e0._0_8_;
        uStack_588 = local_5e0._8_8_;
        local_650 = local_650 * (float)local_4e0;
        fStack_64c = fStack_64c * local_4e0._4_4_;
        fStack_648 = fStack_648 * (float)uStack_4d8;
        fStack_644 = fStack_644 * uStack_4d8._4_4_;
        local_420 = CONCAT44(fStack_64c,local_650);
        uStack_418 = CONCAT44(fStack_644,fStack_648);
        local_430 = 0x3f000000;
        uStack_42c = 0x3f000000;
        uStack_428 = 0x3f000000;
        uStack_424 = 0x3f000000;
        local_650 = local_650 + 0.5;
        fStack_64c = fStack_64c + 0.5;
        fStack_648 = fStack_648 + 0.5;
        fStack_644 = fStack_644 + 0.5;
        local_5a0 = CONCAT44(fStack_64c,local_650);
        uStack_598 = CONCAT44(fStack_644,fStack_648);
        local_5b0 = CONCAT44(fStack_63c,local_640);
        uStack_5a8 = CONCAT44(fStack_634,fStack_638);
        local_650 = local_650 * local_640;
        fStack_64c = fStack_64c * fStack_63c;
        fStack_648 = fStack_648 * fStack_638;
        fStack_644 = fStack_644 * fStack_634;
        local_440 = CONCAT44(fStack_64c,local_650);
        uStack_438 = CONCAT44(fStack_644,fStack_648);
        local_450 = local_5e0._0_8_;
        uStack_448 = local_5e0._8_8_;
        local_650 = local_650 + (float)local_4e0;
        fStack_64c = fStack_64c + local_4e0._4_4_;
        fStack_648 = fStack_648 + (float)uStack_4d8;
        fStack_644 = fStack_644 + uStack_4d8._4_4_;
        local_460 = CONCAT44(fStack_64c,local_650);
        uStack_458 = CONCAT44(fStack_644,fStack_648);
        local_470 = 0x3f8000003f800000;
        uStack_468 = 0x3f8000003f800000;
        local_650 = local_650 + 1.0;
        fStack_64c = fStack_64c + 1.0;
        fStack_648 = fStack_648 + 1.0;
        fStack_644 = fStack_644 + 1.0;
        local_1b0 = local_600;
        uStack_1a8 = uStack_5f8;
        local_610._4_4_ = (int)local_4a0._4_4_;
        local_610._0_4_ = (int)(float)local_4a0;
        local_610._8_4_ = (int)(float)uStack_498;
        local_610._12_4_ = (int)uStack_498._4_4_;
        local_c0 = local_610._0_8_;
        uStack_b8 = local_610._8_8_;
        local_d0 = 0x7f0000007f;
        uStack_c8 = 0x7f0000007f;
        auVar45._8_8_ = local_610._8_8_;
        auVar45._0_8_ = local_610._0_8_;
        auVar44._8_8_ = 0x7f0000007f;
        auVar44._0_8_ = 0x7f0000007f;
        auVar2 = vpaddd_avx(auVar45,auVar44);
        local_610._0_8_ = auVar2._0_8_;
        local_80 = local_610._0_8_;
        local_610._8_8_ = auVar2._8_8_;
        uStack_78 = local_610._8_8_;
        local_84 = 0x17;
        local_610 = vpslld_avx(auVar2,ZEXT416(0x17));
        local_50 = local_610._0_8_;
        uStack_48 = local_610._8_8_;
        local_660 = local_610._0_8_;
        uStack_658 = local_610._8_8_;
        local_5c0._4_4_ = fStack_64c;
        local_5c0._0_4_ = local_650;
        local_5c0._8_4_ = fStack_648;
        local_5c0._12_4_ = fStack_644;
        local_5d0._0_4_ = local_610._0_4_;
        local_5d0._4_4_ = local_610._4_4_;
        uStack_5c8._0_4_ = local_610._8_4_;
        uStack_5c8._4_4_ = local_610._12_4_;
        local_650 = local_650 * (float)local_5d0;
        fStack_64c = fStack_64c * local_5d0._4_4_;
        fStack_648 = fStack_648 * (float)uStack_5c8;
        fStack_644 = fStack_644 * uStack_5c8._4_4_;
        local_970 = CONCAT44(fStack_64c,local_650);
        uStack_968 = CONCAT44(fStack_644,fStack_648);
        local_9b0 = local_650 + 1.0;
        fStack_9ac = fStack_64c + 1.0;
        fStack_9a8 = fStack_648 + 1.0;
        fStack_9a4 = fStack_644 + 1.0;
        auVar30._4_4_ = fStack_9ac;
        auVar30._0_4_ = local_9b0;
        auVar30._8_4_ = fStack_9a8;
        auVar30._12_4_ = fStack_9a4;
        _local_a90 = vdivps_avx(local_9a0,auVar30);
        local_a80._0_4_ = SUB84(local_2210,0);
        local_a80._4_4_ = (undefined4)((ulong)local_2210 >> 0x20);
        fStack_a78 = SUB84(piStack_2208,0);
        fStack_a74 = (float)((ulong)piStack_2208 >> 0x20);
        local_1fc0 = (float)local_a80._0_4_ * (float)local_a90._0_4_;
        fStack_1fbc = (float)local_a80._4_4_ * (float)local_a90._4_4_;
        fStack_1fb8 = fStack_a78 * fStack_a88;
        fStack_1fb4 = fStack_a74 * fStack_a84;
        uVar14 = fStack_1fbc;
        uVar12 = local_1fc0;
        auVar13._0_8_ = CONCAT44(uVar14,uVar12);
        auVar13._8_4_ = fStack_1fb8;
        auVar13._12_4_ = fStack_1fb4;
        local_1fe8->data = (void *)auVar13._0_8_;
        local_1fe8->refcount = (int *)auVar13._8_8_;
        local_21b0 = (Mat *)&local_21b0->elemsize;
        local_1f90 = local_2210;
        piStack_1f88 = piStack_2208;
        _local_a80 = local_a40;
        uStack_9ec = local_9f0;
        uStack_9e8 = local_9f0;
        uStack_9e4 = local_9f0;
        local_960 = local_9a0;
        local_5d0 = local_610._0_8_;
        uStack_5c8 = local_610._8_8_;
        local_4e0 = local_4f0;
        uStack_4d8 = uStack_4e8;
        local_4a0 = local_600;
        uStack_498 = uStack_5f8;
        local_480 = uVar7;
        uStack_478 = uVar8;
        local_290 = local_2210;
        piStack_288 = piStack_2208;
        local_240 = local_270;
      }
    }
  }
  else {
    for (local_2214 = 0; local_2214 < local_20fc; local_2214 = local_2214 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffffdd30,(int)((ulong)in_stack_ffffffffffffdd28 >> 0x20));
      pauVar53 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_2268);
      ncnn::Mat::~Mat((Mat *)0x90464e);
      local_2220 = pauVar53;
      for (local_226c = 0; local_226c + 7 < local_2100; local_226c = local_226c + 8) {
        local_20d0 = local_2220;
        local_2040 = *(undefined8 *)*local_2220;
        uStack_2038 = *(undefined8 *)(*local_2220 + 8);
        uStack_2030 = *(undefined8 *)(*local_2220 + 0x10);
        auVar48 = *(undefined1 (*) [24])*local_2220;
        uStack_2028 = *(undefined8 *)(*local_2220 + 0x18);
        auVar11 = *local_2220;
        local_2088 = local_2220;
        local_1e68 = 0x3f800000;
        local_ec0 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_ee0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_ed0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_1ec0 = local_ee0._0_8_;
        uStack_1eb8 = local_ee0._8_8_;
        uStack_1eb0 = auStack_ed0._0_8_;
        uStack_1ea8 = auStack_ed0._8_8_;
        local_1e40._16_8_ = auStack_ed0._0_8_;
        local_1e40._0_16_ = local_ee0;
        local_1e40._24_8_ = auStack_ed0._8_8_;
        local_f80 = ZEXT832(0) << 0x20;
        local_1000 = 0;
        local_f60._8_8_ = SUB328(ZEXT832(0),4);
        uStack_ff8 = local_f60._8_8_;
        uStack_ff0 = 0;
        uStack_fe8 = 0;
        local_1ea0._0_8_ = auVar48._0_8_;
        local_1020 = local_1ea0._0_8_;
        local_1ea0._8_8_ = auVar48._8_8_;
        uStack_1018 = local_1ea0._8_8_;
        local_1ea0._16_8_ = auVar48._16_8_;
        uStack_1010 = local_1ea0._16_8_;
        auVar6 = vsubps_avx(ZEXT832((ulong)local_f60._8_8_) << 0x40,*local_2220);
        local_1ce0 = 0x3f800000;
        uStack_1cdc = 0x3f800000;
        uStack_1cd8 = 0x3f800000;
        uStack_1cd4 = 0x3f800000;
        uStack_1cd0 = 0x3f800000;
        uStack_1ccc = 0x3f800000;
        uStack_1cc8 = 0x3f800000;
        uStack_1cc4 = 0x3f800000;
        local_1c60._0_8_ = auVar6._0_8_;
        local_e40 = local_1c60._0_8_;
        local_1c60._8_8_ = auVar6._8_8_;
        uStack_e38 = local_1c60._8_8_;
        local_1c60._16_8_ = auVar6._16_8_;
        uStack_e30 = local_1c60._16_8_;
        local_1c60._24_8_ = auVar6._24_8_;
        uStack_e28 = local_1c60._24_8_;
        local_e60 = 0x42b0c0a5;
        uStack_e5c = 0x42b0c0a5;
        uStack_e58 = 0x42b0c0a5;
        uStack_e54 = 0x42b0c0a5;
        uStack_e50 = 0x42b0c0a5;
        uStack_e4c = 0x42b0c0a5;
        uStack_e48 = 0x42b0c0a5;
        uStack_e44 = 0x42b0c0a5;
        auVar21._8_4_ = 0x42b0c0a5;
        auVar21._0_8_ = 0x42b0c0a542b0c0a5;
        auVar21._12_4_ = 0x42b0c0a5;
        auVar21._16_4_ = 0x42b0c0a5;
        auVar21._20_4_ = 0x42b0c0a5;
        auVar21._24_4_ = 0x42b0c0a5;
        auVar21._28_4_ = 0x42b0c0a5;
        auVar6 = vminps_avx(auVar6,auVar21);
        local_1c60._0_8_ = auVar6._0_8_;
        local_dc0 = local_1c60._0_8_;
        local_1c60._8_8_ = auVar6._8_8_;
        uStack_db8 = local_1c60._8_8_;
        local_1c60._16_8_ = auVar6._16_8_;
        uStack_db0 = local_1c60._16_8_;
        local_1c60._24_8_ = auVar6._24_8_;
        uStack_da8 = local_1c60._24_8_;
        local_de0 = 0xc2b0c0a5;
        uStack_ddc = 0xc2b0c0a5;
        uStack_dd8 = 0xc2b0c0a5;
        uStack_dd4 = 0xc2b0c0a5;
        uStack_dd0 = 0xc2b0c0a5;
        uStack_dcc = 0xc2b0c0a5;
        uStack_dc8 = 0xc2b0c0a5;
        uStack_dc4 = 0xc2b0c0a5;
        auVar23._8_4_ = 0xc2b0c0a5;
        auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar23._12_4_ = 0xc2b0c0a5;
        auVar23._16_4_ = 0xc2b0c0a5;
        auVar23._20_4_ = 0xc2b0c0a5;
        auVar23._24_4_ = 0xc2b0c0a5;
        auVar23._28_4_ = 0xc2b0c0a5;
        auVar4 = vmaxps_avx(auVar6,auVar23);
        local_1c60._0_8_ = auVar4._0_8_;
        uVar7 = local_1c60._0_8_;
        local_1c60._8_8_ = auVar4._8_8_;
        uVar8 = local_1c60._8_8_;
        local_1c60._16_8_ = auVar4._16_8_;
        uVar9 = local_1c60._16_8_;
        local_1c60._24_8_ = auVar4._24_8_;
        uVar10 = local_1c60._24_8_;
        local_19c0 = 0x3fb8aa3b;
        uStack_19bc = 0x3fb8aa3b;
        uStack_19b8 = 0x3fb8aa3b;
        uStack_19b4 = 0x3fb8aa3b;
        uStack_19b0 = 0x3fb8aa3b;
        uStack_19ac = 0x3fb8aa3b;
        uStack_19a8 = 0x3fb8aa3b;
        uStack_19a4 = 0x3fb8aa3b;
        local_19a0._0_4_ = auVar4._0_4_;
        local_19a0._4_4_ = auVar4._4_4_;
        uStack_1998._0_4_ = auVar4._8_4_;
        uStack_1998._4_4_ = auVar4._12_4_;
        uStack_1990._0_4_ = auVar4._16_4_;
        uStack_1990._4_4_ = auVar4._20_4_;
        uStack_1988._0_4_ = auVar4._24_4_;
        uStack_1988._4_4_ = auVar4._28_4_;
        local_1ca0._4_4_ = local_19a0._4_4_ * 1.442695;
        local_1ca0._0_4_ = (float)local_19a0 * 1.442695;
        uStack_1c98._0_4_ = (float)uStack_1998 * 1.442695;
        uStack_1c98._4_4_ = uStack_1998._4_4_ * 1.442695;
        uStack_1c90._0_4_ = (float)uStack_1990 * 1.442695;
        uStack_1c90._4_4_ = uStack_1990._4_4_ * 1.442695;
        auVar52 = _local_1ca0;
        uStack_1c88._0_4_ = (float)uStack_1988 * 1.442695;
        uStack_1c88._4_4_ = uStack_1988._4_4_;
        auVar6 = _local_1ca0;
        local_17a0 = local_1ca0;
        uStack_1798 = uStack_1c98;
        uStack_1c90 = auVar52._16_8_;
        uStack_1790 = uStack_1c90;
        uStack_1c88 = auVar6._24_8_;
        uStack_1788 = uStack_1c88;
        local_17c0 = 0x3f000000;
        uStack_17bc = 0x3f000000;
        uStack_17b8 = 0x3f000000;
        uStack_17b4 = 0x3f000000;
        uStack_17b0 = 0x3f000000;
        uStack_17ac = 0x3f000000;
        uStack_17a8 = 0x3f000000;
        uStack_17a4 = 0x3f000000;
        local_1ca0._4_4_ = local_19a0._4_4_ * 1.442695 + 0.5;
        local_1ca0._0_4_ = (float)local_19a0 * 1.442695 + 0.5;
        uStack_1c98._0_4_ = (float)uStack_1998 * 1.442695 + 0.5;
        uStack_1c98._4_4_ = uStack_1998._4_4_ * 1.442695 + 0.5;
        uStack_1c90._0_4_ = (float)uStack_1990 * 1.442695 + 0.5;
        uStack_1c90._4_4_ = uStack_1990._4_4_ * 1.442695 + 0.5;
        uStack_1c88._0_4_ = (float)uStack_1988 * 1.442695 + 0.5;
        uStack_1c88._4_4_ = uStack_1988._4_4_ + 0.5;
        auVar5 = vroundps_avx(_local_1ca0,1);
        auVar6 = vcmpps_avx(_local_1ca0,auVar5,1);
        local_1d00._0_8_ = auVar6._0_8_;
        local_d40 = local_1d00._0_8_;
        local_1d00._8_8_ = auVar6._8_8_;
        uStack_d38 = local_1d00._8_8_;
        local_1d00._16_8_ = auVar6._16_8_;
        uStack_d30 = local_1d00._16_8_;
        local_1d00._24_8_ = auVar6._24_8_;
        uStack_d28 = local_1d00._24_8_;
        local_d60 = 0x3f8000003f800000;
        uStack_d58 = 0x3f8000003f800000;
        uStack_d50 = 0x3f8000003f800000;
        uStack_d48 = 0x3f8000003f800000;
        auVar25._8_8_ = 0x3f8000003f800000;
        auVar25._0_8_ = 0x3f8000003f800000;
        auVar25._16_8_ = 0x3f8000003f800000;
        auVar25._24_8_ = 0x3f8000003f800000;
        local_1d00 = vpand_avx2(auVar6,auVar25);
        local_1c80 = auVar5._0_8_;
        local_1040 = local_1c80;
        uStack_1c78 = auVar5._8_8_;
        uStack_1038 = uStack_1c78;
        uStack_1c70 = auVar5._16_8_;
        uStack_1030 = uStack_1c70;
        uStack_1c68 = auVar5._24_8_;
        uStack_1028 = uStack_1c68;
        local_1060 = local_1d00._0_8_;
        uStack_1058 = local_1d00._8_8_;
        uStack_1050 = local_1d00._16_8_;
        uStack_1048 = local_1d00._24_8_;
        _local_1ca0 = vsubps_avx(auVar5,local_1d00);
        local_1a00 = 0x3f318000;
        uStack_19fc = 0x3f318000;
        uStack_19f8 = 0x3f318000;
        uStack_19f4 = 0x3f318000;
        uStack_19f0 = 0x3f318000;
        uStack_19ec = 0x3f318000;
        uStack_19e8 = 0x3f318000;
        uStack_19e4 = 0x3f318000;
        local_19e0._0_4_ = local_1ca0._0_4_;
        local_19e0._4_4_ = local_1ca0._4_4_;
        uStack_19d8._0_4_ = local_1ca0._8_4_;
        uStack_19d8._4_4_ = local_1ca0._12_4_;
        uStack_19d0._0_4_ = local_1ca0._16_4_;
        uStack_19d0._4_4_ = local_1ca0._20_4_;
        uStack_19c8._0_4_ = local_1ca0._24_4_;
        uStack_19c8._4_4_ = local_1ca0._28_4_;
        local_1c80._4_4_ = local_19e0._4_4_ * 0.6933594;
        local_1c80._0_4_ = (float)local_19e0 * 0.6933594;
        uStack_1c78._0_4_ = (float)uStack_19d8 * 0.6933594;
        uStack_1c78._4_4_ = uStack_19d8._4_4_ * 0.6933594;
        uStack_1c70._0_4_ = (float)uStack_19d0 * 0.6933594;
        uStack_1c70._4_4_ = uStack_19d0._4_4_ * 0.6933594;
        auVar52 = _local_1c80;
        uStack_1c68._0_4_ = (float)uStack_19c8 * 0.6933594;
        uStack_1c68._4_4_ = uStack_19c8._4_4_;
        auVar21 = _local_1c80;
        local_1a20 = local_1ca0;
        uStack_1a18 = uStack_1c98;
        uStack_1a10 = uStack_1c90;
        uStack_1a08 = uStack_1c88;
        local_1a40 = 0xb95e8083;
        uStack_1a3c = 0xb95e8083;
        uStack_1a38 = 0xb95e8083;
        uStack_1a34 = 0xb95e8083;
        uStack_1a30 = 0xb95e8083;
        uStack_1a2c = 0xb95e8083;
        uStack_1a28 = 0xb95e8083;
        uStack_1a24 = 0xb95e8083;
        local_1080 = local_1c60._0_8_;
        uStack_1078 = local_1c60._8_8_;
        uStack_1070 = local_1c60._16_8_;
        uStack_1068 = local_1c60._24_8_;
        local_10a0 = local_1c80;
        uStack_1098 = uStack_1c78;
        uStack_1c70 = auVar52._16_8_;
        uStack_1090 = uStack_1c70;
        uStack_1c68 = auVar21._24_8_;
        uStack_1088 = uStack_1c68;
        auVar19._16_8_ = uStack_1c70;
        auVar19._0_16_ = _local_1c80;
        auVar19._24_8_ = uStack_1c68;
        auVar6 = vsubps_avx(auVar4,auVar19);
        local_1c60._0_8_ = auVar6._0_8_;
        local_10c0 = local_1c60._0_8_;
        local_1c60._8_8_ = auVar6._8_8_;
        uStack_10b8 = local_1c60._8_8_;
        local_1c60._16_8_ = auVar6._16_8_;
        uStack_10b0 = local_1c60._16_8_;
        local_1c60._24_8_ = auVar6._24_8_;
        uStack_10a8 = local_1c60._24_8_;
        local_10e0 = CONCAT44(local_19e0._4_4_ * -0.00021219444,(float)local_19e0 * -0.00021219444);
        uStack_10d8 = CONCAT44(uStack_19d8._4_4_ * -0.00021219444,
                               (float)uStack_19d8 * -0.00021219444);
        uStack_10d0 = CONCAT44(uStack_19d0._4_4_ * -0.00021219444,
                               (float)uStack_19d0 * -0.00021219444);
        uStack_10c8 = CONCAT44(uStack_19c8._4_4_,(float)uStack_19c8 * -0.00021219444);
        auVar5._8_8_ = uStack_10d8;
        auVar5._0_8_ = local_10e0;
        auVar5._16_8_ = uStack_10d0;
        auVar5._24_8_ = uStack_10c8;
        local_1c60 = vsubps_avx(auVar6,auVar5);
        local_1a80 = local_1c60._0_8_;
        uStack_1a78 = local_1c60._8_8_;
        uStack_1a70 = local_1c60._16_8_;
        uStack_1a68 = local_1c60._24_8_;
        local_1a60._0_4_ = local_1c60._0_4_;
        local_1a60._4_4_ = local_1c60._4_4_;
        uStack_1a58._0_4_ = local_1c60._8_4_;
        uStack_1a58._4_4_ = local_1c60._12_4_;
        uStack_1a50._0_4_ = local_1c60._16_4_;
        uStack_1a50._4_4_ = local_1c60._20_4_;
        uStack_1a48._0_4_ = local_1c60._24_4_;
        uStack_1a48._4_4_ = local_1c60._28_4_;
        fStack_1d04 = uStack_1a48._4_4_;
        local_1d20 = (float)local_1a60 * (float)local_1a60;
        fStack_1d1c = local_1a60._4_4_ * local_1a60._4_4_;
        fStack_1d18 = (float)uStack_1a58 * (float)uStack_1a58;
        fStack_1d14 = uStack_1a58._4_4_ * uStack_1a58._4_4_;
        fStack_1d10 = (float)uStack_1a50 * (float)uStack_1a50;
        fStack_1d0c = uStack_1a50._4_4_ * uStack_1a50._4_4_;
        fStack_1d08 = (float)uStack_1a48 * (float)uStack_1a48;
        local_1aa0 = 0x3950696739506967;
        uStack_1a98 = 0x3950696739506967;
        uStack_1a90 = 0x3950696739506967;
        uStack_1a88 = 0x3950696739506967;
        local_1ac0 = local_1c60._0_8_;
        uStack_1ab8 = local_1c60._8_8_;
        uStack_1ab0 = local_1c60._16_8_;
        uStack_1aa8 = local_1c60._24_8_;
        local_17e0 = CONCAT44(local_1a60._4_4_ * 0.00019875691,(float)local_1a60 * 0.00019875691);
        uStack_17d8 = CONCAT44(uStack_1a58._4_4_ * 0.00019875691,(float)uStack_1a58 * 0.00019875691)
        ;
        uStack_17d0 = CONCAT44(uStack_1a50._4_4_ * 0.00019875691,(float)uStack_1a50 * 0.00019875691)
        ;
        uStack_17c8 = CONCAT44(0x39506967,(float)uStack_1a48 * 0.00019875691);
        local_1800 = 0x3ab743ce;
        uStack_17fc = 0x3ab743ce;
        uStack_17f8 = 0x3ab743ce;
        uStack_17f4 = 0x3ab743ce;
        uStack_17f0 = 0x3ab743ce;
        uStack_17ec = 0x3ab743ce;
        uStack_17e8 = 0x3ab743ce;
        uStack_17e4 = 0x3ab743ce;
        local_1d40 = (float)local_1a60 * 0.00019875691 + 0.0013981999;
        fStack_1d3c = local_1a60._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1d38 = (float)uStack_1a58 * 0.00019875691 + 0.0013981999;
        fStack_1d34 = uStack_1a58._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1d30 = (float)uStack_1a50 * 0.00019875691 + 0.0013981999;
        fStack_1d2c = uStack_1a50._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1d28 = (float)uStack_1a48 * 0.00019875691 + 0.0013981999;
        local_1ae0 = CONCAT44(fStack_1d3c,local_1d40);
        uStack_1ad8 = CONCAT44(fStack_1d34,fStack_1d38);
        uStack_1ad0 = CONCAT44(fStack_1d2c,fStack_1d30);
        uStack_1ac8 = CONCAT44(0x3ad150fb,fStack_1d28);
        local_1b00 = local_1c60._0_8_;
        uStack_1af8 = local_1c60._8_8_;
        uStack_1af0 = local_1c60._16_8_;
        uStack_1ae8 = local_1c60._24_8_;
        local_1d40 = local_1d40 * (float)local_1a60;
        fStack_1d3c = fStack_1d3c * local_1a60._4_4_;
        fStack_1d38 = fStack_1d38 * (float)uStack_1a58;
        fStack_1d34 = fStack_1d34 * uStack_1a58._4_4_;
        fStack_1d30 = fStack_1d30 * (float)uStack_1a50;
        fStack_1d2c = fStack_1d2c * uStack_1a50._4_4_;
        fStack_1d28 = fStack_1d28 * (float)uStack_1a48;
        local_1820 = CONCAT44(fStack_1d3c,local_1d40);
        uStack_1818 = CONCAT44(fStack_1d34,fStack_1d38);
        uStack_1810 = CONCAT44(fStack_1d2c,fStack_1d30);
        uStack_1808 = CONCAT44(0x3ad150fb,fStack_1d28);
        local_1840 = 0x3c088908;
        uStack_183c = 0x3c088908;
        uStack_1838 = 0x3c088908;
        uStack_1834 = 0x3c088908;
        uStack_1830 = 0x3c088908;
        uStack_182c = 0x3c088908;
        uStack_1828 = 0x3c088908;
        uStack_1824 = 0x3c088908;
        local_1d40 = local_1d40 + 0.008333452;
        fStack_1d3c = fStack_1d3c + 0.008333452;
        fStack_1d38 = fStack_1d38 + 0.008333452;
        fStack_1d34 = fStack_1d34 + 0.008333452;
        fStack_1d30 = fStack_1d30 + 0.008333452;
        fStack_1d2c = fStack_1d2c + 0.008333452;
        fStack_1d28 = fStack_1d28 + 0.008333452;
        local_1b20 = CONCAT44(fStack_1d3c,local_1d40);
        uStack_1b18 = CONCAT44(fStack_1d34,fStack_1d38);
        uStack_1b10 = CONCAT44(fStack_1d2c,fStack_1d30);
        uStack_1b08 = CONCAT44(0x3c22b327,fStack_1d28);
        local_1b40 = local_1c60._0_8_;
        uStack_1b38 = local_1c60._8_8_;
        uStack_1b30 = local_1c60._16_8_;
        uStack_1b28 = local_1c60._24_8_;
        local_1d40 = local_1d40 * (float)local_1a60;
        fStack_1d3c = fStack_1d3c * local_1a60._4_4_;
        fStack_1d38 = fStack_1d38 * (float)uStack_1a58;
        fStack_1d34 = fStack_1d34 * uStack_1a58._4_4_;
        fStack_1d30 = fStack_1d30 * (float)uStack_1a50;
        fStack_1d2c = fStack_1d2c * uStack_1a50._4_4_;
        fStack_1d28 = fStack_1d28 * (float)uStack_1a48;
        local_1860 = CONCAT44(fStack_1d3c,local_1d40);
        uStack_1858 = CONCAT44(fStack_1d34,fStack_1d38);
        uStack_1850 = CONCAT44(fStack_1d2c,fStack_1d30);
        uStack_1848 = CONCAT44(0x3c22b327,fStack_1d28);
        local_1880 = 0x3d2aa9c1;
        uStack_187c = 0x3d2aa9c1;
        uStack_1878 = 0x3d2aa9c1;
        uStack_1874 = 0x3d2aa9c1;
        uStack_1870 = 0x3d2aa9c1;
        uStack_186c = 0x3d2aa9c1;
        uStack_1868 = 0x3d2aa9c1;
        uStack_1864 = 0x3d2aa9c1;
        local_1d40 = local_1d40 + 0.041665796;
        fStack_1d3c = fStack_1d3c + 0.041665796;
        fStack_1d38 = fStack_1d38 + 0.041665796;
        fStack_1d34 = fStack_1d34 + 0.041665796;
        fStack_1d30 = fStack_1d30 + 0.041665796;
        fStack_1d2c = fStack_1d2c + 0.041665796;
        fStack_1d28 = fStack_1d28 + 0.041665796;
        local_1b60 = CONCAT44(fStack_1d3c,local_1d40);
        uStack_1b58 = CONCAT44(fStack_1d34,fStack_1d38);
        uStack_1b50 = CONCAT44(fStack_1d2c,fStack_1d30);
        uStack_1b48 = CONCAT44(0x3d53568b,fStack_1d28);
        local_1b80 = local_1c60._0_8_;
        uStack_1b78 = local_1c60._8_8_;
        uStack_1b70 = local_1c60._16_8_;
        uStack_1b68 = local_1c60._24_8_;
        local_1d40 = local_1d40 * (float)local_1a60;
        fStack_1d3c = fStack_1d3c * local_1a60._4_4_;
        fStack_1d38 = fStack_1d38 * (float)uStack_1a58;
        fStack_1d34 = fStack_1d34 * uStack_1a58._4_4_;
        fStack_1d30 = fStack_1d30 * (float)uStack_1a50;
        fStack_1d2c = fStack_1d2c * uStack_1a50._4_4_;
        fStack_1d28 = fStack_1d28 * (float)uStack_1a48;
        local_18a0 = CONCAT44(fStack_1d3c,local_1d40);
        uStack_1898 = CONCAT44(fStack_1d34,fStack_1d38);
        uStack_1890 = CONCAT44(fStack_1d2c,fStack_1d30);
        uStack_1888 = CONCAT44(0x3d53568b,fStack_1d28);
        local_18c0 = 0x3e2aaaaa;
        uStack_18bc = 0x3e2aaaaa;
        uStack_18b8 = 0x3e2aaaaa;
        uStack_18b4 = 0x3e2aaaaa;
        uStack_18b0 = 0x3e2aaaaa;
        uStack_18ac = 0x3e2aaaaa;
        uStack_18a8 = 0x3e2aaaaa;
        uStack_18a4 = 0x3e2aaaaa;
        local_1d40 = local_1d40 + 0.16666666;
        fStack_1d3c = fStack_1d3c + 0.16666666;
        fStack_1d38 = fStack_1d38 + 0.16666666;
        fStack_1d34 = fStack_1d34 + 0.16666666;
        fStack_1d30 = fStack_1d30 + 0.16666666;
        fStack_1d2c = fStack_1d2c + 0.16666666;
        fStack_1d28 = fStack_1d28 + 0.16666666;
        local_1ba0 = CONCAT44(fStack_1d3c,local_1d40);
        uStack_1b98 = CONCAT44(fStack_1d34,fStack_1d38);
        uStack_1b90 = CONCAT44(fStack_1d2c,fStack_1d30);
        uStack_1b88 = CONCAT44(0x3e5f804d,fStack_1d28);
        local_1bc0 = local_1c60._0_8_;
        uStack_1bb8 = local_1c60._8_8_;
        uStack_1bb0 = local_1c60._16_8_;
        uStack_1ba8 = local_1c60._24_8_;
        local_1d40 = local_1d40 * (float)local_1a60;
        fStack_1d3c = fStack_1d3c * local_1a60._4_4_;
        fStack_1d38 = fStack_1d38 * (float)uStack_1a58;
        fStack_1d34 = fStack_1d34 * uStack_1a58._4_4_;
        fStack_1d30 = fStack_1d30 * (float)uStack_1a50;
        fStack_1d2c = fStack_1d2c * uStack_1a50._4_4_;
        fStack_1d28 = fStack_1d28 * (float)uStack_1a48;
        local_18e0 = CONCAT44(fStack_1d3c,local_1d40);
        uStack_18d8 = CONCAT44(fStack_1d34,fStack_1d38);
        uStack_18d0 = CONCAT44(fStack_1d2c,fStack_1d30);
        uStack_18c8 = CONCAT44(0x3e5f804d,fStack_1d28);
        local_1900 = 0x3f000000;
        uStack_18fc = 0x3f000000;
        uStack_18f8 = 0x3f000000;
        uStack_18f4 = 0x3f000000;
        uStack_18f0 = 0x3f000000;
        uStack_18ec = 0x3f000000;
        uStack_18e8 = 0x3f000000;
        uStack_18e4 = 0x3f000000;
        local_1d40 = local_1d40 + 0.5;
        fStack_1d3c = fStack_1d3c + 0.5;
        fStack_1d38 = fStack_1d38 + 0.5;
        fStack_1d34 = fStack_1d34 + 0.5;
        fStack_1d30 = fStack_1d30 + 0.5;
        fStack_1d2c = fStack_1d2c + 0.5;
        fStack_1d28 = fStack_1d28 + 0.5;
        local_1be0 = CONCAT44(fStack_1d3c,local_1d40);
        uStack_1bd8 = CONCAT44(fStack_1d34,fStack_1d38);
        uStack_1bd0 = CONCAT44(fStack_1d2c,fStack_1d30);
        uStack_1bc8 = CONCAT44(0x3f37e013,fStack_1d28);
        local_1c00 = CONCAT44(fStack_1d1c,local_1d20);
        uStack_1bf8 = CONCAT44(fStack_1d14,fStack_1d18);
        uStack_1bf0 = CONCAT44(fStack_1d0c,fStack_1d10);
        uStack_1be8 = CONCAT44(uStack_1a48._4_4_,fStack_1d08);
        local_1d40 = local_1d40 * local_1d20;
        fStack_1d3c = fStack_1d3c * fStack_1d1c;
        fStack_1d38 = fStack_1d38 * fStack_1d18;
        fStack_1d34 = fStack_1d34 * fStack_1d14;
        fStack_1d30 = fStack_1d30 * fStack_1d10;
        fStack_1d2c = fStack_1d2c * fStack_1d0c;
        fStack_1d28 = fStack_1d28 * fStack_1d08;
        local_1920 = CONCAT44(fStack_1d3c,local_1d40);
        uStack_1918 = CONCAT44(fStack_1d34,fStack_1d38);
        uStack_1910 = CONCAT44(fStack_1d2c,fStack_1d30);
        uStack_1908 = CONCAT44(0x3f37e013,fStack_1d28);
        local_1940 = local_1c60._0_8_;
        uStack_1938 = local_1c60._8_8_;
        uStack_1930 = local_1c60._16_8_;
        uStack_1928 = local_1c60._24_8_;
        local_1d40 = local_1d40 + (float)local_1a60;
        fStack_1d3c = fStack_1d3c + local_1a60._4_4_;
        fStack_1d38 = fStack_1d38 + (float)uStack_1a58;
        fStack_1d34 = fStack_1d34 + uStack_1a58._4_4_;
        fStack_1d30 = fStack_1d30 + (float)uStack_1a50;
        fStack_1d2c = fStack_1d2c + uStack_1a50._4_4_;
        fStack_1d28 = fStack_1d28 + (float)uStack_1a48;
        local_1960 = CONCAT44(fStack_1d3c,local_1d40);
        uStack_1958 = CONCAT44(fStack_1d34,fStack_1d38);
        uStack_1950 = CONCAT44(fStack_1d2c,fStack_1d30);
        uStack_1948 = CONCAT44(uStack_1a48._4_4_ + 0.71826285,fStack_1d28);
        local_1980 = 0x3f8000003f800000;
        uStack_1978 = 0x3f8000003f800000;
        uStack_1970 = 0x3f8000003f800000;
        uStack_1968 = 0x3f8000003f800000;
        local_1d40 = local_1d40 + 1.0;
        fStack_1d3c = fStack_1d3c + 1.0;
        fStack_1d38 = fStack_1d38 + 1.0;
        fStack_1d34 = fStack_1d34 + 1.0;
        fStack_1d30 = fStack_1d30 + 1.0;
        fStack_1d2c = fStack_1d2c + 1.0;
        fStack_1d28 = fStack_1d28 + 1.0;
        fStack_1d24 = uStack_1a48._4_4_ + 0.71826285 + 1.0;
        local_d00 = local_1ca0;
        uStack_cf8 = uStack_1c98;
        uStack_cf0 = uStack_1c90;
        uStack_ce8 = uStack_1c88;
        local_1cc0._4_4_ = (int)local_19e0._4_4_;
        local_1cc0._0_4_ = (int)(float)local_19e0;
        local_1cc0._8_4_ = (int)(float)uStack_19d8;
        local_1cc0._12_4_ = (int)uStack_19d8._4_4_;
        local_1cc0._16_4_ = (int)(float)uStack_19d0;
        local_1cc0._20_4_ = (int)uStack_19d0._4_4_;
        auVar52 = local_1cc0._0_24_;
        local_1cc0._24_4_ = (int)(float)uStack_19c8;
        local_1cc0._28_4_ = (int)uStack_19c8._4_4_;
        auVar6 = local_1cc0;
        local_c80 = local_1cc0._0_8_;
        uStack_c78 = local_1cc0._8_8_;
        local_1cc0._16_8_ = auVar52._16_8_;
        uStack_c70 = local_1cc0._16_8_;
        local_1cc0._24_8_ = auVar6._24_8_;
        uStack_c68 = local_1cc0._24_8_;
        local_ca0 = 0x7f0000007f;
        uStack_c98 = 0x7f0000007f;
        uStack_c90 = 0x7f0000007f;
        uStack_c88 = 0x7f0000007f;
        local_b80 = local_1cc0._0_8_;
        uStack_b78 = local_1cc0._8_8_;
        uStack_b70 = local_1cc0._16_8_;
        uStack_b68 = local_1cc0._24_8_;
        local_ba0 = 0x7f0000007f;
        uStack_b98 = 0x7f0000007f;
        uStack_b90 = 0x7f0000007f;
        uStack_b88 = 0x7f0000007f;
        auVar27._16_8_ = local_1cc0._16_8_;
        auVar27._0_16_ = local_1cc0._0_16_;
        auVar27._24_8_ = local_1cc0._24_8_;
        auVar26._8_8_ = 0x7f0000007f;
        auVar26._0_8_ = 0x7f0000007f;
        auVar26._16_8_ = 0x7f0000007f;
        auVar26._24_8_ = 0x7f0000007f;
        auVar6 = vpaddd_avx2(auVar27,auVar26);
        local_1cc0._0_8_ = auVar6._0_8_;
        local_c00 = local_1cc0._0_8_;
        local_1cc0._8_8_ = auVar6._8_8_;
        uStack_bf8 = local_1cc0._8_8_;
        local_1cc0._16_8_ = auVar6._16_8_;
        uStack_bf0 = local_1cc0._16_8_;
        local_1cc0._24_8_ = auVar6._24_8_;
        uStack_be8 = local_1cc0._24_8_;
        local_c04 = 0x17;
        local_b00 = local_1cc0._0_8_;
        uStack_af8 = local_1cc0._8_8_;
        uStack_af0 = local_1cc0._16_8_;
        uStack_ae8 = local_1cc0._24_8_;
        local_b04 = 0x17;
        local_1cc0 = vpslld_avx2(auVar6,ZEXT416(0x17));
        local_bc0 = local_1cc0._0_8_;
        uStack_bb8 = local_1cc0._8_8_;
        uStack_bb0 = local_1cc0._16_8_;
        uStack_ba8 = local_1cc0._24_8_;
        local_1d60 = local_1cc0._0_8_;
        uStack_1d58 = local_1cc0._8_8_;
        uStack_1d50 = local_1cc0._16_8_;
        uStack_1d48 = local_1cc0._24_8_;
        local_1c20._4_4_ = fStack_1d3c;
        local_1c20._0_4_ = local_1d40;
        local_1c20._8_4_ = fStack_1d38;
        local_1c20._12_4_ = fStack_1d34;
        local_1c20._16_4_ = fStack_1d30;
        local_1c20._20_4_ = fStack_1d2c;
        local_1c20._24_4_ = fStack_1d28;
        local_1c20._28_4_ = fStack_1d24;
        local_1c40._0_4_ = local_1cc0._0_4_;
        local_1c40._4_4_ = local_1cc0._4_4_;
        uStack_1c38._0_4_ = local_1cc0._8_4_;
        uStack_1c38._4_4_ = local_1cc0._12_4_;
        uStack_1c30._0_4_ = local_1cc0._16_4_;
        uStack_1c30._4_4_ = local_1cc0._20_4_;
        uStack_1c28._0_4_ = local_1cc0._24_4_;
        local_1d40 = local_1d40 * (float)local_1c40;
        fStack_1d3c = fStack_1d3c * local_1c40._4_4_;
        fStack_1d38 = fStack_1d38 * (float)uStack_1c38;
        fStack_1d34 = fStack_1d34 * uStack_1c38._4_4_;
        fStack_1d30 = fStack_1d30 * (float)uStack_1c30;
        fStack_1d2c = fStack_1d2c * uStack_1c30._4_4_;
        fStack_1d28 = fStack_1d28 * (float)uStack_1c28;
        local_1de0 = CONCAT44(fStack_1d3c,local_1d40);
        uStack_1dd8 = CONCAT44(fStack_1d34,fStack_1d38);
        uStack_1dd0 = CONCAT44(fStack_1d2c,fStack_1d30);
        uStack_1dc8 = CONCAT44(fStack_1d24,fStack_1d28);
        local_1dc0._0_4_ = local_ee0._0_4_;
        local_1dc0._4_4_ = local_ee0._4_4_;
        fStack_1db8 = local_ee0._8_4_;
        fStack_1db4 = local_ee0._12_4_;
        fStack_1db0 = auStack_ed0._0_4_;
        fStack_1dac = auStack_ed0._4_4_;
        fStack_1da8 = auStack_ed0._8_4_;
        fStack_1da4 = auStack_ed0._12_4_;
        local_1e60 = (float)local_1dc0._0_4_ + local_1d40;
        fStack_1e5c = (float)local_1dc0._4_4_ + fStack_1d3c;
        fStack_1e58 = fStack_1db8 + fStack_1d38;
        fStack_1e54 = fStack_1db4 + fStack_1d34;
        fStack_1e50 = fStack_1db0 + fStack_1d30;
        fStack_1e4c = fStack_1dac + fStack_1d2c;
        fStack_1e48 = fStack_1da8 + fStack_1d28;
        fStack_1e44 = fStack_1da4 + fStack_1d24;
        auVar4._4_4_ = fStack_1e5c;
        auVar4._0_4_ = local_1e60;
        auVar4._8_4_ = fStack_1e58;
        auVar4._12_4_ = fStack_1e54;
        auVar4._16_4_ = fStack_1e50;
        auVar4._20_4_ = fStack_1e4c;
        auVar4._24_4_ = fStack_1e48;
        auVar4._28_4_ = fStack_1e44;
        _local_1f40 = vdivps_avx(local_1e40,auVar4);
        local_1f20._0_4_ = auVar48._0_4_;
        local_1f20._4_4_ = auVar48._4_4_;
        fStack_1f18 = auVar48._8_4_;
        fStack_1f14 = auVar48._12_4_;
        fStack_1f10 = auVar48._16_4_;
        fStack_1f0c = auVar48._20_4_;
        fStack_1f08 = (float)uStack_2028;
        uStack_1f04 = (undefined4)((ulong)uStack_2028 >> 0x20);
        uStack_20a4 = uStack_1f04;
        local_20c0 = (float)local_1f20._0_4_ * (float)local_1f40._0_4_;
        fStack_20bc = (float)local_1f20._4_4_ * (float)local_1f40._4_4_;
        fStack_20b8 = fStack_1f18 * fStack_1f38;
        fStack_20b4 = fStack_1f14 * fStack_1f34;
        fStack_20b0 = fStack_1f10 * fStack_1f30;
        fStack_20ac = fStack_1f0c * fStack_1f2c;
        fStack_20a8 = fStack_1f08 * fStack_1f28;
        auVar6._4_4_ = fStack_20bc;
        auVar6._0_4_ = local_20c0;
        auVar6._8_4_ = fStack_20b8;
        auVar6._12_4_ = fStack_20b4;
        auVar6._16_4_ = fStack_20b0;
        auVar6._20_4_ = fStack_20ac;
        auVar6._24_4_ = fStack_20a8;
        auVar6._28_4_ = uStack_1f04;
        *local_2220 = auVar6;
        local_2220 = local_2220 + 1;
        _local_1f20 = auVar11;
        local_1ea0 = auVar11;
        _local_1dc0 = local_1e40;
        _local_1c80 = auVar21;
        local_1c40 = local_1cc0._0_8_;
        uStack_1c38 = local_1cc0._8_8_;
        uStack_1c30 = local_1cc0._16_8_;
        uStack_1c28 = local_1cc0._24_8_;
        local_1a60 = local_1a80;
        uStack_1a58 = uStack_1a78;
        uStack_1a50 = uStack_1a70;
        uStack_1a48 = uStack_1a68;
        local_19e0 = local_1ca0;
        uStack_19d8 = uStack_1c98;
        uStack_19d0 = uStack_1c90;
        uStack_19c8 = uStack_1c88;
        local_19a0 = uVar7;
        uStack_1998 = uVar8;
        uStack_1990 = uVar9;
        uStack_1988 = uVar10;
        uStack_1008 = uStack_2028;
        local_f60 = local_f80;
        local_ebc = local_ec0;
        local_eb8 = local_ec0;
        local_eb4 = local_ec0;
        local_eb0 = local_ec0;
        local_eac = local_ec0;
        local_ea8 = local_ec0;
        local_ea4 = local_ec0;
      }
      for (; local_226c + 3 < local_2100; local_226c = local_226c + 4) {
        local_1ff0 = local_2220;
        local_1fa0 = *(undefined8 *)*local_2220;
        uStack_1f98 = *(undefined8 *)(*local_2220 + 8);
        local_a20 = *(undefined1 (*) [16])*local_2220;
        local_1fc8 = local_2220;
        local_9f4 = 0x3f800000;
        local_a10 = 0x3f800000;
        local_a30 = 0x3f8000003f800000;
        uStack_a28 = 0x3f8000003f800000;
        local_9c0._8_8_ = 0x3f8000003f800000;
        local_9c0._0_8_ = 0x3f8000003f800000;
        local_260 = ZEXT816(0) << 0x20;
        local_2a0 = 0;
        local_250._8_8_ = SUB168(ZEXT816(0),4);
        uStack_298 = local_250._8_8_;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = local_250._8_8_;
        auVar2 = vsubps_avx(auVar51 << 0x40,*(undefined1 (*) [16])*local_2220);
        local_910 = 0x3f800000;
        uStack_90c = 0x3f800000;
        uStack_908 = 0x3f800000;
        uStack_904 = 0x3f800000;
        local_8d0._0_8_ = auVar2._0_8_;
        local_200 = local_8d0._0_8_;
        local_8d0._8_8_ = auVar2._8_8_;
        uStack_1f8 = local_8d0._8_8_;
        local_210 = 0x42b0c0a5;
        uStack_20c = 0x42b0c0a5;
        uStack_208 = 0x42b0c0a5;
        uStack_204 = 0x42b0c0a5;
        auVar35._8_4_ = 0x42b0c0a5;
        auVar35._0_8_ = 0x42b0c0a542b0c0a5;
        auVar35._12_4_ = 0x42b0c0a5;
        auVar2 = vminps_avx(auVar2,auVar35);
        local_8d0._0_8_ = auVar2._0_8_;
        local_1c0 = local_8d0._0_8_;
        local_8d0._8_8_ = auVar2._8_8_;
        uStack_1b8 = local_8d0._8_8_;
        local_1d0 = 0xc2b0c0a5;
        uStack_1cc = 0xc2b0c0a5;
        uStack_1c8 = 0xc2b0c0a5;
        uStack_1c4 = 0xc2b0c0a5;
        auVar37._8_4_ = 0xc2b0c0a5;
        auVar37._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar37._12_4_ = 0xc2b0c0a5;
        auVar3 = vmaxps_avx(auVar2,auVar37);
        local_8d0._0_8_ = auVar3._0_8_;
        uVar7 = local_8d0._0_8_;
        local_8d0._8_8_ = auVar3._8_8_;
        uVar8 = local_8d0._8_8_;
        local_780 = 0x3fb8aa3b;
        uStack_77c = 0x3fb8aa3b;
        uStack_778 = 0x3fb8aa3b;
        uStack_774 = 0x3fb8aa3b;
        local_770._0_4_ = auVar3._0_4_;
        local_770._4_4_ = auVar3._4_4_;
        uStack_768._0_4_ = auVar3._8_4_;
        uStack_768._4_4_ = auVar3._12_4_;
        local_8f0._4_4_ = local_770._4_4_ * 1.442695;
        local_8f0._0_4_ = (float)local_770 * 1.442695;
        uStack_8e8._0_4_ = (float)uStack_768 * 1.442695;
        uStack_8e8._4_4_ = uStack_768._4_4_ * 1.442695;
        local_670 = local_8f0;
        uStack_668 = uStack_8e8;
        local_680 = 0x3f000000;
        uStack_67c = 0x3f000000;
        uStack_678 = 0x3f000000;
        uStack_674 = 0x3f000000;
        local_8f0._0_4_ = (float)local_770 * 1.442695 + 0.5;
        local_8f0._4_4_ = local_770._4_4_ * 1.442695 + 0.5;
        fVar55 = (float)uStack_768 * 1.442695 + 0.5;
        fVar56 = uStack_768._4_4_ * 1.442695 + 0.5;
        uStack_8e8._0_4_ = fVar55;
        uStack_8e8._4_4_ = fVar56;
        local_180 = local_8f0;
        uStack_178 = uStack_8e8;
        local_900._4_4_ = (int)(float)local_8f0._4_4_;
        local_900._0_4_ = (int)(float)local_8f0._0_4_;
        local_900._8_4_ = (int)fVar55;
        local_900._12_4_ = (int)fVar56;
        local_160 = local_900._0_8_;
        uStack_158 = local_900._8_8_;
        auVar39._8_8_ = local_900._8_8_;
        auVar39._0_8_ = local_900._0_8_;
        auVar1 = vcvtdq2ps_avx(auVar39);
        local_8e0 = auVar1._0_8_;
        local_120 = local_8e0;
        uStack_8d8 = auVar1._8_8_;
        uStack_118 = uStack_8d8;
        local_130 = local_8f0;
        uStack_128 = uStack_8e8;
        auVar41._8_8_ = uStack_8e8;
        auVar41._0_8_ = local_8f0;
        auVar2 = vcmpps_avx(auVar41,auVar1,1);
        local_920._0_8_ = auVar2._0_8_;
        local_e0 = local_920._0_8_;
        local_920._8_8_ = auVar2._8_8_;
        uStack_d8 = local_920._8_8_;
        local_f0 = 0x3f8000003f800000;
        uStack_e8 = 0x3f8000003f800000;
        auVar43._8_8_ = 0x3f8000003f800000;
        auVar43._0_8_ = 0x3f8000003f800000;
        local_920 = vpand_avx(auVar2,auVar43);
        local_2c0 = local_8e0;
        uStack_2b8 = uStack_8d8;
        local_2d0 = local_920._0_8_;
        uStack_2c8 = local_920._8_8_;
        _local_8f0 = vsubps_avx(auVar1,local_920);
        local_7a0 = 0x3f318000;
        uStack_79c = 0x3f318000;
        uStack_798 = 0x3f318000;
        uStack_794 = 0x3f318000;
        local_790._0_4_ = local_8f0._0_4_;
        local_790._4_4_ = local_8f0._4_4_;
        uStack_788._0_4_ = local_8f0._8_4_;
        uStack_788._4_4_ = local_8f0._12_4_;
        local_8e0 = CONCAT44(local_790._4_4_ * 0.6933594,(float)local_790 * 0.6933594);
        uStack_8d8._0_4_ = (float)uStack_788 * 0.6933594;
        uStack_8d8._4_4_ = uStack_788._4_4_ * 0.6933594;
        local_7b0 = local_8f0;
        uStack_7a8 = uStack_8e8;
        local_7c0 = 0xb95e8083;
        uStack_7bc = 0xb95e8083;
        uStack_7b8 = 0xb95e8083;
        uStack_7b4 = 0xb95e8083;
        local_2e0 = local_8d0._0_8_;
        uStack_2d8 = local_8d0._8_8_;
        local_2f0 = local_8e0;
        uStack_2e8 = uStack_8d8;
        auVar33._8_8_ = uStack_8d8;
        auVar33._0_8_ = local_8e0;
        auVar2 = vsubps_avx(auVar3,auVar33);
        local_8d0._0_8_ = auVar2._0_8_;
        local_300 = local_8d0._0_8_;
        local_8d0._8_8_ = auVar2._8_8_;
        uStack_2f8 = local_8d0._8_8_;
        local_310 = CONCAT44(local_790._4_4_ * -0.00021219444,(float)local_790 * -0.00021219444);
        uStack_308 = CONCAT44(uStack_788._4_4_ * -0.00021219444,(float)uStack_788 * -0.00021219444);
        auVar3._8_8_ = uStack_308;
        auVar3._0_8_ = local_310;
        local_8d0 = vsubps_avx(auVar2,auVar3);
        local_7e0 = local_8d0._0_8_;
        uStack_7d8 = local_8d0._8_8_;
        local_7d0._0_4_ = local_8d0._0_4_;
        local_7d0._4_4_ = local_8d0._4_4_;
        uStack_7c8._0_4_ = local_8d0._8_4_;
        uStack_7c8._4_4_ = local_8d0._12_4_;
        local_930 = (float)local_7d0 * (float)local_7d0;
        fStack_92c = local_7d0._4_4_ * local_7d0._4_4_;
        fStack_928 = (float)uStack_7c8 * (float)uStack_7c8;
        fStack_924 = uStack_7c8._4_4_ * uStack_7c8._4_4_;
        local_7f0 = 0x3950696739506967;
        uStack_7e8 = 0x3950696739506967;
        local_800 = local_8d0._0_8_;
        uStack_7f8 = local_8d0._8_8_;
        local_690 = CONCAT44(local_7d0._4_4_ * 0.00019875691,(float)local_7d0 * 0.00019875691);
        uStack_688 = CONCAT44(uStack_7c8._4_4_ * 0.00019875691,(float)uStack_7c8 * 0.00019875691);
        local_6a0 = 0x3ab743ce;
        uStack_69c = 0x3ab743ce;
        uStack_698 = 0x3ab743ce;
        uStack_694 = 0x3ab743ce;
        local_940 = (float)local_7d0 * 0.00019875691 + 0.0013981999;
        fStack_93c = local_7d0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_938 = (float)uStack_7c8 * 0.00019875691 + 0.0013981999;
        fStack_934 = uStack_7c8._4_4_ * 0.00019875691 + 0.0013981999;
        local_810 = CONCAT44(fStack_93c,local_940);
        uStack_808 = CONCAT44(fStack_934,fStack_938);
        local_820 = local_8d0._0_8_;
        uStack_818 = local_8d0._8_8_;
        local_940 = local_940 * (float)local_7d0;
        fStack_93c = fStack_93c * local_7d0._4_4_;
        fStack_938 = fStack_938 * (float)uStack_7c8;
        fStack_934 = fStack_934 * uStack_7c8._4_4_;
        local_6b0 = CONCAT44(fStack_93c,local_940);
        uStack_6a8 = CONCAT44(fStack_934,fStack_938);
        local_6c0 = 0x3c088908;
        uStack_6bc = 0x3c088908;
        uStack_6b8 = 0x3c088908;
        uStack_6b4 = 0x3c088908;
        local_940 = local_940 + 0.008333452;
        fStack_93c = fStack_93c + 0.008333452;
        fStack_938 = fStack_938 + 0.008333452;
        fStack_934 = fStack_934 + 0.008333452;
        local_830 = CONCAT44(fStack_93c,local_940);
        uStack_828 = CONCAT44(fStack_934,fStack_938);
        local_840 = local_8d0._0_8_;
        uStack_838 = local_8d0._8_8_;
        local_940 = local_940 * (float)local_7d0;
        fStack_93c = fStack_93c * local_7d0._4_4_;
        fStack_938 = fStack_938 * (float)uStack_7c8;
        fStack_934 = fStack_934 * uStack_7c8._4_4_;
        local_6d0 = CONCAT44(fStack_93c,local_940);
        uStack_6c8 = CONCAT44(fStack_934,fStack_938);
        local_6e0 = 0x3d2aa9c1;
        uStack_6dc = 0x3d2aa9c1;
        uStack_6d8 = 0x3d2aa9c1;
        uStack_6d4 = 0x3d2aa9c1;
        local_940 = local_940 + 0.041665796;
        fStack_93c = fStack_93c + 0.041665796;
        fStack_938 = fStack_938 + 0.041665796;
        fStack_934 = fStack_934 + 0.041665796;
        local_850 = CONCAT44(fStack_93c,local_940);
        uStack_848 = CONCAT44(fStack_934,fStack_938);
        local_860 = local_8d0._0_8_;
        uStack_858 = local_8d0._8_8_;
        local_940 = local_940 * (float)local_7d0;
        fStack_93c = fStack_93c * local_7d0._4_4_;
        fStack_938 = fStack_938 * (float)uStack_7c8;
        fStack_934 = fStack_934 * uStack_7c8._4_4_;
        local_6f0 = CONCAT44(fStack_93c,local_940);
        uStack_6e8 = CONCAT44(fStack_934,fStack_938);
        local_700 = 0x3e2aaaaa;
        uStack_6fc = 0x3e2aaaaa;
        uStack_6f8 = 0x3e2aaaaa;
        uStack_6f4 = 0x3e2aaaaa;
        local_940 = local_940 + 0.16666666;
        fStack_93c = fStack_93c + 0.16666666;
        fStack_938 = fStack_938 + 0.16666666;
        fStack_934 = fStack_934 + 0.16666666;
        local_870 = CONCAT44(fStack_93c,local_940);
        uStack_868 = CONCAT44(fStack_934,fStack_938);
        local_880 = local_8d0._0_8_;
        uStack_878 = local_8d0._8_8_;
        local_940 = local_940 * (float)local_7d0;
        fStack_93c = fStack_93c * local_7d0._4_4_;
        fStack_938 = fStack_938 * (float)uStack_7c8;
        fStack_934 = fStack_934 * uStack_7c8._4_4_;
        local_710 = CONCAT44(fStack_93c,local_940);
        uStack_708 = CONCAT44(fStack_934,fStack_938);
        local_720 = 0x3f000000;
        uStack_71c = 0x3f000000;
        uStack_718 = 0x3f000000;
        uStack_714 = 0x3f000000;
        local_940 = local_940 + 0.5;
        fStack_93c = fStack_93c + 0.5;
        fStack_938 = fStack_938 + 0.5;
        fStack_934 = fStack_934 + 0.5;
        local_890 = CONCAT44(fStack_93c,local_940);
        uStack_888 = CONCAT44(fStack_934,fStack_938);
        local_8a0 = CONCAT44(fStack_92c,local_930);
        uStack_898 = CONCAT44(fStack_924,fStack_928);
        local_940 = local_940 * local_930;
        fStack_93c = fStack_93c * fStack_92c;
        fStack_938 = fStack_938 * fStack_928;
        fStack_934 = fStack_934 * fStack_924;
        local_730 = CONCAT44(fStack_93c,local_940);
        uStack_728 = CONCAT44(fStack_934,fStack_938);
        local_740 = local_8d0._0_8_;
        uStack_738 = local_8d0._8_8_;
        local_940 = local_940 + (float)local_7d0;
        fStack_93c = fStack_93c + local_7d0._4_4_;
        fStack_938 = fStack_938 + (float)uStack_7c8;
        fStack_934 = fStack_934 + uStack_7c8._4_4_;
        local_750 = CONCAT44(fStack_93c,local_940);
        uStack_748 = CONCAT44(fStack_934,fStack_938);
        local_760 = 0x3f8000003f800000;
        uStack_758 = 0x3f8000003f800000;
        local_940 = local_940 + 1.0;
        fStack_93c = fStack_93c + 1.0;
        fStack_938 = fStack_938 + 1.0;
        fStack_934 = fStack_934 + 1.0;
        local_190 = local_8f0;
        uStack_188 = uStack_8e8;
        local_900._4_4_ = (int)local_790._4_4_;
        local_900._0_4_ = (int)(float)local_790;
        local_900._8_4_ = (int)(float)uStack_788;
        local_900._12_4_ = (int)uStack_788._4_4_;
        local_a0 = local_900._0_8_;
        uStack_98 = local_900._8_8_;
        local_b0 = 0x7f0000007f;
        uStack_a8 = 0x7f0000007f;
        auVar47._8_8_ = local_900._8_8_;
        auVar47._0_8_ = local_900._0_8_;
        auVar46._8_8_ = 0x7f0000007f;
        auVar46._0_8_ = 0x7f0000007f;
        auVar2 = vpaddd_avx(auVar47,auVar46);
        local_900._0_8_ = auVar2._0_8_;
        local_60 = local_900._0_8_;
        local_900._8_8_ = auVar2._8_8_;
        uStack_58 = local_900._8_8_;
        local_64 = 0x17;
        local_900 = vpslld_avx(auVar2,ZEXT416(0x17));
        local_40 = local_900._0_8_;
        uStack_38 = local_900._8_8_;
        local_950 = local_900._0_8_;
        uStack_948 = local_900._8_8_;
        local_8b0._4_4_ = fStack_93c;
        local_8b0._0_4_ = local_940;
        local_8b0._8_4_ = fStack_938;
        local_8b0._12_4_ = fStack_934;
        local_8c0._0_4_ = local_900._0_4_;
        local_8c0._4_4_ = local_900._4_4_;
        uStack_8b8._0_4_ = local_900._8_4_;
        uStack_8b8._4_4_ = local_900._12_4_;
        local_940 = local_940 * (float)local_8c0;
        fStack_93c = fStack_93c * local_8c0._4_4_;
        fStack_938 = fStack_938 * (float)uStack_8b8;
        fStack_934 = fStack_934 * uStack_8b8._4_4_;
        local_990 = CONCAT44(fStack_93c,local_940);
        uStack_988 = CONCAT44(fStack_934,fStack_938);
        local_9d0 = local_940 + 1.0;
        fStack_9cc = fStack_93c + 1.0;
        fStack_9c8 = fStack_938 + 1.0;
        fStack_9c4 = fStack_934 + 1.0;
        auVar1._4_4_ = fStack_9cc;
        auVar1._0_4_ = local_9d0;
        auVar1._8_4_ = fStack_9c8;
        auVar1._12_4_ = fStack_9c4;
        _local_a70 = vdivps_avx(local_9c0,auVar1);
        local_a60._0_4_ = (undefined4)local_1fa0;
        local_a60._4_4_ = (undefined4)((ulong)local_1fa0 >> 0x20);
        fStack_a58 = (float)uStack_1f98;
        fStack_a54 = (float)((ulong)uStack_1f98 >> 0x20);
        local_1fe0 = (float)local_a60._0_4_ * (float)local_a70._0_4_;
        fStack_1fdc = (float)local_a60._4_4_ * (float)local_a70._4_4_;
        fStack_1fd8 = fStack_a58 * fStack_a68;
        fStack_1fd4 = fStack_a54 * fStack_a64;
        auVar2._4_4_ = fStack_1fdc;
        auVar2._0_4_ = local_1fe0;
        auVar2._8_4_ = fStack_1fd8;
        auVar2._12_4_ = fStack_1fd4;
        *(undefined1 (*) [16])*local_2220 = auVar2;
        local_2220 = (undefined1 (*) [32])(*local_2220 + 0x10);
        _local_a60 = local_a20;
        uStack_a0c = local_a10;
        uStack_a08 = local_a10;
        uStack_a04 = local_a10;
        local_980 = local_9c0;
        local_8c0 = local_900._0_8_;
        uStack_8b8 = local_900._8_8_;
        local_7d0 = local_7e0;
        uStack_7c8 = uStack_7d8;
        local_790 = local_8f0;
        uStack_788 = uStack_8e8;
        local_770 = uVar7;
        uStack_768 = uVar8;
        local_2b0 = local_1fa0;
        uStack_2a8 = uStack_1f98;
        local_250 = local_260;
      }
      for (; local_226c < local_2100; local_226c = local_226c + 1) {
        fVar55 = *(float *)*local_2220;
        dVar54 = std::exp((double)(ulong)(*(uint *)*local_2220 ^ 0x80000000));
        *(float *)*local_2220 = fVar55 / (SUB84(dVar54,0) + 1.0);
        local_2220 = (undefined1 (*) [32])(*local_2220 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int Swish_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, swish_avx(_p));
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, swish_sse(_p));
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, swish_avx(_p));
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(ptr, swish_sse(_p));
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}